

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

void embree::sse42::InstanceIntersectorKMB<4>::intersect
               (vbool<4> *valid_i,Precalculations *pre,RayHitK<4> *ray,RayQueryContext *context,
               Primitive *prim)

{
  RayHitK<4> *pRVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  Vector *pVVar7;
  int iVar8;
  Instance *pIVar9;
  RTCRayQueryContext *pRVar10;
  AffineSpace3ff *pAVar11;
  AffineSpace3ff *pAVar12;
  AffineSpace3ff *pAVar13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ulong uVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  uint uVar26;
  int iVar27;
  float fVar28;
  uint uVar29;
  float fVar49;
  float fVar52;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar55;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar50;
  uint uVar53;
  uint uVar56;
  undefined1 auVar37 [16];
  uint uVar51;
  uint uVar54;
  uint uVar57;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar58;
  float fVar72;
  float fVar73;
  undefined1 auVar59 [16];
  float fVar74;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float fVar116;
  float fVar118;
  undefined1 in_XMM4 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar104;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar155;
  float fVar188;
  float fVar189;
  undefined1 in_XMM6 [16];
  float fVar190;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar191;
  float fVar192;
  float fVar198;
  float fVar199;
  undefined1 in_XMM7 [16];
  float fVar200;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar201;
  float fVar208;
  float fVar209;
  undefined1 in_XMM8 [16];
  float fVar210;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar220;
  float fVar221;
  undefined1 auVar212 [16];
  float fVar222;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  int iVar228;
  float fVar229;
  int iVar232;
  int iVar235;
  undefined1 in_XMM11 [16];
  float fVar233;
  float fVar234;
  float fVar236;
  float fVar237;
  int iVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar241;
  float fVar245;
  float fVar246;
  undefined1 in_XMM12 [16];
  float fVar247;
  undefined1 auVar242 [16];
  float fVar248;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar249;
  float fVar250;
  float fVar258;
  float fVar260;
  undefined1 in_XMM13 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar259;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar264;
  float fVar265;
  float fVar273;
  float fVar275;
  undefined1 in_XMM14 [16];
  float fVar277;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar274;
  float fVar276;
  float fVar278;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar279;
  float fVar280;
  undefined8 uVar281;
  float fVar289;
  undefined1 in_XMM15 [16];
  float fVar286;
  float fVar292;
  undefined1 auVar282 [16];
  float fVar287;
  float fVar290;
  float fVar293;
  undefined1 auVar283 [16];
  float fVar288;
  float fVar291;
  float fVar294;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  RayQueryContext newcontext;
  undefined1 local_258 [8];
  undefined8 uStack_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_124;
  float local_118;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  RTCIntersectArguments *local_88;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  pIVar9 = prim->instance;
  uVar26 = (pIVar9->super_Geometry).mask;
  auVar212._0_4_ = -(uint)((uVar26 & *(uint *)(ray + 0x90)) == 0);
  auVar212._4_4_ = -(uint)((uVar26 & *(uint *)(ray + 0x94)) == 0);
  auVar212._8_4_ = -(uint)((uVar26 & *(uint *)(ray + 0x98)) == 0);
  auVar212._12_4_ = -(uint)((uVar26 & *(uint *)(ray + 0x9c)) == 0);
  local_48 = ~auVar212 & (undefined1  [16])valid_i->field_0;
  uVar26 = movmskps((int)pre,local_48);
  if ((uVar26 != 0) && (pRVar10 = context->user, pRVar10->instID[0] == 0xffffffff)) {
    pRVar10->instID[0] = prim->instID_;
    pRVar10->instPrimID[0] = 0;
    auVar212 = local_48;
    if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar103 = (pIVar9->super_Geometry).fnumTimeSegments;
      fVar116 = (pIVar9->super_Geometry).time_range.lower;
      auVar109._0_4_ = (pIVar9->super_Geometry).time_range.upper - fVar116;
      auVar95._4_4_ = fVar116;
      auVar95._0_4_ = fVar116;
      auVar95._8_4_ = fVar116;
      auVar95._12_4_ = fVar116;
      auVar123._4_4_ = fVar103;
      auVar123._0_4_ = fVar103;
      auVar123._8_4_ = fVar103;
      auVar123._12_4_ = fVar103;
      auVar214._0_4_ = *(float *)(ray + 0x70) - fVar116;
      auVar214._4_4_ = *(float *)(ray + 0x74) - fVar116;
      auVar214._8_4_ = *(float *)(ray + 0x78) - fVar116;
      auVar214._12_4_ = *(float *)(ray + 0x7c) - fVar116;
      auVar109._4_4_ = auVar109._0_4_;
      auVar109._8_4_ = auVar109._0_4_;
      auVar109._12_4_ = auVar109._0_4_;
      auVar106 = divps(auVar214,auVar109);
      auVar224._0_4_ = auVar106._0_4_ * fVar103;
      auVar224._4_4_ = auVar106._4_4_ * fVar103;
      auVar224._8_4_ = auVar106._8_4_ * fVar103;
      auVar224._12_4_ = auVar106._12_4_ * fVar103;
      auVar95 = roundps(auVar95,auVar224,1);
      auVar106._0_4_ = fVar103 + -1.0;
      auVar106._4_4_ = auVar106._0_4_;
      auVar106._8_4_ = auVar106._0_4_;
      auVar106._12_4_ = auVar106._0_4_;
      auVar106 = minps(auVar95,auVar106);
      auVar157._0_12_ = ZEXT812(0);
      auVar157._12_4_ = 0;
      auVar106 = maxps(auVar106,auVar157);
      fVar103 = auVar224._0_4_ - auVar106._0_4_;
      fVar116 = auVar224._4_4_ - auVar106._4_4_;
      fVar118 = auVar224._8_4_ - auVar106._8_4_;
      fVar120 = auVar224._12_4_ - auVar106._12_4_;
      iVar228 = (int)auVar106._0_4_;
      iVar232 = (int)auVar106._4_4_;
      iVar235 = (int)auVar106._8_4_;
      iVar238 = (int)auVar106._12_4_;
      local_98 = CONCAT44(iVar232,iVar228);
      uStack_90 = (RTCRayQueryContext *)CONCAT44(iVar238,iVar235);
      lVar14 = 0;
      if ((uVar26 & 0xff) != 0) {
        for (; ((uVar26 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      iVar8 = *(int *)((long)&local_98 + lVar14 * 4);
      auVar252._0_4_ = -(uint)(iVar8 == iVar228);
      auVar252._4_4_ = -(uint)(iVar8 == iVar232);
      auVar252._8_4_ = -(uint)(iVar8 == iVar235);
      auVar252._12_4_ = -(uint)(iVar8 == iVar238);
      iVar27 = movmskps((int)valid_i,~auVar252 & local_48);
      if (iVar27 == 0) {
        pAVar12 = pIVar9->local2world;
        pAVar13 = pAVar12 + iVar8;
        fVar28 = (pAVar13->l).vx.field_0.m128[1];
        fVar49 = (pAVar13->l).vx.field_0.m128[2];
        fVar52 = (pAVar13->l).vx.field_0.m128[3];
        pVVar2 = &pAVar12[iVar8].p;
        fVar55 = (pVVar2->field_0).m128[1];
        fVar192 = (pVVar2->field_0).m128[2];
        local_58._4_4_ = *(float *)((long)&pVVar2->field_0 + 0xc);
        local_58._0_4_ = local_58._4_4_;
        fStack_50 = (float)local_58._4_4_;
        fStack_4c = (float)local_58._4_4_;
        pAVar11 = pAVar12 + (long)iVar8 + 1;
        fVar93 = (pAVar11->l).vx.field_0.m128[3];
        auVar282._4_4_ = fVar93;
        auVar282._0_4_ = fVar93;
        auVar282._8_4_ = fVar93;
        auVar282._12_4_ = fVar93;
        pVVar3 = &pAVar12[(long)iVar8 + 1].p;
        fVar100 = *(float *)((long)&pVVar3->field_0 + 0xc);
        auVar215._4_4_ = fVar100;
        auVar215._0_4_ = fVar100;
        auVar215._8_4_ = fVar100;
        auVar215._12_4_ = fVar100;
        pVVar4 = &pAVar12[iVar8].l.vy;
        fVar101 = (pVVar4->field_0).m128[1];
        fVar102 = (pVVar4->field_0).m128[2];
        fVar234 = *(float *)((long)&pVVar4->field_0 + 0xc);
        pVVar5 = &pAVar12[(long)iVar8 + 1].l.vy;
        fVar237 = *(float *)((long)&pVVar5->field_0 + 0xc);
        auVar194._4_4_ = fVar237;
        auVar194._0_4_ = fVar237;
        auVar194._8_4_ = fVar237;
        auVar194._12_4_ = fVar237;
        pVVar6 = &pAVar12[iVar8].l.vz;
        fVar240 = (pVVar6->field_0).m128[1];
        fVar104 = (pVVar6->field_0).m128[2];
        fVar58 = *(float *)((long)&pVVar6->field_0 + 0xc);
        pVVar7 = &pAVar12[(long)iVar8 + 1].l.vz;
        fVar72 = *(float *)((long)&pVVar7->field_0 + 0xc);
        auVar253._4_4_ = fVar72;
        auVar253._0_4_ = fVar72;
        auVar253._8_4_ = fVar72;
        auVar253._12_4_ = fVar72;
        auVar96._0_4_ =
             fVar58 * fVar72 + fVar234 * fVar237 + fVar52 * fVar93 + (float)local_58._4_4_ * fVar100
        ;
        auVar96._4_4_ =
             fVar58 * fVar72 + fVar234 * fVar237 + fVar52 * fVar93 + (float)local_58._4_4_ * fVar100
        ;
        auVar96._8_4_ =
             fVar58 * fVar72 + fVar234 * fVar237 + fVar52 * fVar93 + (float)local_58._4_4_ * fVar100
        ;
        auVar96._12_4_ =
             fVar58 * fVar72 + fVar234 * fVar237 + fVar52 * fVar93 + (float)local_58._4_4_ * fVar100
        ;
        uVar19 = CONCAT44(auVar96._4_4_,auVar96._0_4_);
        auVar32._4_4_ = -(uint)(auVar96._4_4_ < -auVar96._4_4_);
        auVar32._0_4_ = -(uint)(auVar96._0_4_ < -auVar96._0_4_);
        auVar32._8_4_ = -(uint)(auVar96._8_4_ < -auVar96._8_4_);
        auVar32._12_4_ = -(uint)(auVar96._12_4_ < -auVar96._12_4_);
        auVar242._8_4_ = -auVar96._8_4_;
        auVar242._0_8_ = uVar19 ^ 0x8000000080000000;
        auVar242._12_4_ = -auVar96._12_4_;
        auVar60._0_8_ = CONCAT44(fVar100,fVar100) ^ 0x8000000080000000;
        auVar60._8_4_ = -fVar100;
        auVar60._12_4_ = -fVar100;
        auVar123 = blendvps(auVar215,auVar60,auVar32);
        auVar61._0_8_ = CONCAT44(fVar93,fVar93) ^ 0x8000000080000000;
        auVar61._8_4_ = -fVar93;
        auVar61._12_4_ = -fVar93;
        auVar224 = blendvps(auVar282,auVar61,auVar32);
        auVar62._0_8_ = CONCAT44(fVar237,fVar237) ^ 0x8000000080000000;
        auVar62._8_4_ = -fVar237;
        auVar62._12_4_ = -fVar237;
        auVar109 = blendvps(auVar194,auVar62,auVar32);
        auVar63._0_8_ = CONCAT44(fVar72,fVar72) ^ 0x8000000080000000;
        auVar63._8_4_ = -fVar72;
        auVar63._12_4_ = -fVar72;
        auVar157 = blendvps(auVar253,auVar63,auVar32);
        _local_78 = maxps(auVar242,auVar96);
        fVar93 = ABS(auVar96._0_4_);
        fVar100 = ABS(auVar96._4_4_);
        uVar19 = CONCAT44(auVar96._4_4_,auVar96._0_4_);
        auVar97._0_8_ = uVar19 & 0x7fffffff7fffffff;
        auVar97._8_4_ = ABS(auVar96._8_4_);
        auVar97._12_4_ = ABS(auVar96._12_4_);
        auVar64._0_4_ = 1.0 - fVar93;
        auVar64._4_4_ = 1.0 - fVar100;
        auVar64._8_4_ = 1.0 - auVar97._8_4_;
        auVar64._12_4_ = 1.0 - auVar97._12_4_;
        auVar106 = sqrtps(auVar64,auVar64);
        auVar33._0_4_ =
             1.5707964 -
             auVar106._0_4_ *
             (((((fVar93 * -0.0043095737 + 0.0192803) * fVar93 + -0.04489909) * fVar93 + 0.08785567)
               * fVar93 + -0.21450998) * fVar93 + 1.5707952);
        auVar33._4_4_ =
             1.5707964 -
             auVar106._4_4_ *
             (((((fVar100 * -0.0043095737 + 0.0192803) * fVar100 + -0.04489909) * fVar100 +
               0.08785567) * fVar100 + -0.21450998) * fVar100 + 1.5707952);
        auVar33._8_4_ =
             1.5707964 -
             auVar106._8_4_ *
             (((((auVar97._8_4_ * -0.0043095737 + 0.0192803) * auVar97._8_4_ + -0.04489909) *
                auVar97._8_4_ + 0.08785567) * auVar97._8_4_ + -0.21450998) * auVar97._8_4_ +
             1.5707952);
        auVar33._12_4_ =
             1.5707964 -
             auVar106._12_4_ *
             (((((auVar97._12_4_ * -0.0043095737 + 0.0192803) * auVar97._12_4_ + -0.04489909) *
                auVar97._12_4_ + 0.08785567) * auVar97._12_4_ + -0.21450998) * auVar97._12_4_ +
             1.5707952);
        auVar106 = maxps(ZEXT816(0),auVar33);
        fVar222 = local_78._0_4_;
        fVar233 = local_78._4_4_;
        fVar239 = local_78._8_4_;
        fVar245 = local_78._12_4_;
        auVar34._4_4_ = -(uint)(fVar233 < 0.0);
        auVar34._0_4_ = -(uint)(fVar222 < 0.0);
        auVar34._8_4_ = -(uint)(fVar239 < 0.0);
        auVar34._12_4_ = -(uint)(fVar245 < 0.0);
        auVar65._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
        auVar65._8_4_ = auVar106._8_4_ ^ 0x80000000;
        auVar65._12_4_ = auVar106._12_4_ ^ 0x80000000;
        auVar106 = blendvps(auVar106,auVar65,auVar34);
        auVar66._0_4_ = 1.5707964 - auVar106._0_4_;
        auVar66._4_4_ = 1.5707964 - auVar106._4_4_;
        auVar66._8_4_ = 1.5707964 - auVar106._8_4_;
        auVar66._12_4_ = 1.5707964 - auVar106._12_4_;
        auVar35._4_4_ = -(uint)(1.0 < fVar100);
        auVar35._0_4_ = -(uint)(1.0 < fVar93);
        auVar35._8_4_ = -(uint)(1.0 < auVar97._8_4_);
        auVar35._12_4_ = -(uint)(1.0 < auVar97._12_4_);
        auVar106 = blendvps(auVar66,_DAT_01ff1c40,auVar35);
        fVar93 = auVar106._0_4_ * fVar103;
        fVar100 = auVar106._4_4_ * fVar116;
        fVar237 = auVar106._8_4_ * fVar118;
        fVar72 = auVar106._12_4_ * fVar120;
        auVar36._0_4_ = fVar93 * 0.63661975;
        auVar36._4_4_ = fVar100 * 0.63661975;
        auVar36._8_4_ = fVar237 * 0.63661975;
        auVar36._12_4_ = fVar72 * 0.63661975;
        auVar106 = roundps(auVar97,auVar36,1);
        uVar26 = (uint)auVar106._0_4_;
        uVar50 = (uint)auVar106._4_4_;
        uVar53 = (uint)auVar106._8_4_;
        uVar56 = (uint)auVar106._12_4_;
        fVar93 = fVar93 - auVar106._0_4_ * 1.5707964;
        fVar100 = fVar100 - auVar106._4_4_ * 1.5707964;
        fVar237 = fVar237 - auVar106._8_4_ * 1.5707964;
        fVar72 = fVar72 - auVar106._12_4_ * 1.5707964;
        uVar29 = uVar26 & 3;
        uVar51 = uVar50 & 3;
        uVar54 = uVar53 & 3;
        uVar57 = uVar56 & 3;
        fVar117 = fVar93 * fVar93;
        fVar73 = fVar100 * fVar100;
        fVar74 = fVar237 * fVar237;
        fVar119 = fVar72 * fVar72;
        uVar26 = uVar26 & 1;
        uVar50 = uVar50 & 1;
        uVar53 = uVar53 & 1;
        uVar56 = uVar56 & 1;
        auVar110._0_4_ = -(uint)(uVar26 == 0);
        auVar110._4_4_ = -(uint)(uVar50 == 0);
        auVar110._8_4_ = -(uint)(uVar53 == 0);
        auVar110._12_4_ = -(uint)(uVar56 == 0);
        auVar158._4_4_ = -uVar50;
        auVar158._0_4_ = -uVar26;
        auVar158._8_4_ = -uVar53;
        auVar158._12_4_ = -uVar56;
        auVar268._0_8_ =
             CONCAT44((((((fVar73 * -2.5029328e-08 + 2.7600126e-06) * fVar73 + -0.00019842605) *
                         fVar73 + 0.008333348) * fVar73 + -0.16666667) * fVar73 + 1.0) * fVar100,
                      (((((fVar117 * -2.5029328e-08 + 2.7600126e-06) * fVar117 + -0.00019842605) *
                         fVar117 + 0.008333348) * fVar117 + -0.16666667) * fVar117 + 1.0) * fVar93);
        auVar268._8_4_ =
             (((((fVar74 * -2.5029328e-08 + 2.7600126e-06) * fVar74 + -0.00019842605) * fVar74 +
               0.008333348) * fVar74 + -0.16666667) * fVar74 + 1.0) * fVar237;
        auVar268._12_4_ =
             (((((fVar119 * -2.5029328e-08 + 2.7600126e-06) * fVar119 + -0.00019842605) * fVar119 +
               0.008333348) * fVar119 + -0.16666667) * fVar119 + 1.0) * fVar72;
        auVar202._0_4_ =
             ((((fVar117 * -2.5963018e-07 + 2.4756235e-05) * fVar117 + -0.001388833) * fVar117 +
              0.04166664) * fVar117 + -0.5) * fVar117 + 1.0;
        auVar202._4_4_ =
             ((((fVar73 * -2.5963018e-07 + 2.4756235e-05) * fVar73 + -0.001388833) * fVar73 +
              0.04166664) * fVar73 + -0.5) * fVar73 + 1.0;
        auVar202._8_4_ =
             ((((fVar74 * -2.5963018e-07 + 2.4756235e-05) * fVar74 + -0.001388833) * fVar74 +
              0.04166664) * fVar74 + -0.5) * fVar74 + 1.0;
        auVar202._12_4_ =
             ((((fVar119 * -2.5963018e-07 + 2.4756235e-05) * fVar119 + -0.001388833) * fVar119 +
              0.04166664) * fVar119 + -0.5) * fVar119 + 1.0;
        auVar124._8_4_ = auVar268._8_4_;
        auVar124._0_8_ = auVar268._0_8_;
        auVar124._12_4_ = auVar268._12_4_;
        auVar106 = blendvps(auVar124,auVar202,auVar158);
        auVar214 = blendvps(auVar268,auVar202,auVar110);
        auVar37._0_4_ = -(uint)(1 < uVar29);
        auVar37._4_4_ = -(uint)(1 < uVar51);
        auVar37._8_4_ = -(uint)(1 < uVar54);
        auVar37._12_4_ = -(uint)(1 < uVar57);
        auVar67._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
        auVar67._8_4_ = auVar106._8_4_ ^ 0x80000000;
        auVar67._12_4_ = auVar106._12_4_ ^ 0x80000000;
        auVar95 = blendvps(auVar106,auVar67,auVar37);
        uVar29 = uVar29 - 1;
        uVar51 = uVar51 - 1;
        uVar54 = uVar54 - 1;
        uVar57 = uVar57 - 1;
        auVar98._0_4_ = -(uint)(((uVar29 == 0) * uVar29 | (uint)(uVar29 != 0)) == uVar29);
        auVar98._4_4_ = -(uint)(((uVar51 == 0) * uVar51 | (uint)(uVar51 != 0)) == uVar51);
        auVar98._8_4_ = -(uint)(((uVar54 == 0) * uVar54 | (uint)(uVar54 != 0)) == uVar54);
        auVar98._12_4_ = -(uint)(((uVar57 == 0) * uVar57 | (uint)(uVar57 != 0)) == uVar57);
        auVar76._0_8_ = auVar214._0_8_ ^ 0x8000000080000000;
        auVar76._8_4_ = auVar214._8_4_ ^ 0x80000000;
        auVar76._12_4_ = auVar214._12_4_ ^ 0x80000000;
        auVar214 = blendvps(auVar214,auVar76,auVar98);
        fVar200 = (float)local_58._4_4_ * fVar222 - auVar123._0_4_;
        fVar201 = (float)local_58._4_4_ * fVar233 - auVar123._4_4_;
        fVar208 = (float)local_58._4_4_ * fVar239 - auVar123._8_4_;
        fVar209 = (float)local_58._4_4_ * fVar245 - auVar123._12_4_;
        fVar93 = fVar52 * fVar222 - auVar224._0_4_;
        fVar100 = fVar52 * fVar233 - auVar224._4_4_;
        fVar237 = fVar52 * fVar239 - auVar224._8_4_;
        fVar72 = fVar52 * fVar245 - auVar224._12_4_;
        fVar117 = fVar234 * fVar222 - auVar109._0_4_;
        fVar73 = fVar234 * fVar233 - auVar109._4_4_;
        fVar74 = fVar234 * fVar239 - auVar109._8_4_;
        fVar119 = fVar234 * fVar245 - auVar109._12_4_;
        local_68 = fVar58 * fVar222 - auVar157._0_4_;
        fStack_64 = fVar58 * fVar233 - auVar157._4_4_;
        fStack_60 = fVar58 * fVar239 - auVar157._8_4_;
        fStack_5c = fVar58 * fVar245 - auVar157._12_4_;
        auVar68._0_4_ =
             local_68 * local_68 + fVar117 * fVar117 + fVar93 * fVar93 + fVar200 * fVar200;
        auVar68._4_4_ =
             fStack_64 * fStack_64 + fVar73 * fVar73 + fVar100 * fVar100 + fVar201 * fVar201;
        auVar68._8_4_ =
             fStack_60 * fStack_60 + fVar74 * fVar74 + fVar237 * fVar237 + fVar208 * fVar208;
        auVar68._12_4_ =
             fStack_5c * fStack_5c + fVar119 * fVar119 + fVar72 * fVar72 + fVar209 * fVar209;
        auVar106 = rsqrtps(auVar110,auVar68);
        fVar121 = auVar106._0_4_;
        fVar155 = auVar106._4_4_;
        fVar188 = auVar106._8_4_;
        fVar189 = auVar106._12_4_;
        fVar229 = fVar121 * 1.5 - fVar121 * fVar121 * auVar68._0_4_ * 0.5 * fVar121;
        fVar236 = fVar155 * 1.5 - fVar155 * fVar155 * auVar68._4_4_ * 0.5 * fVar155;
        fVar241 = fVar188 * 1.5 - fVar188 * fVar188 * auVar68._8_4_ * 0.5 * fVar188;
        fVar246 = fVar189 * 1.5 - fVar189 * fVar189 * auVar68._12_4_ * 0.5 * fVar189;
        fVar190 = auVar95._0_4_;
        fVar191 = auVar95._4_4_;
        fVar198 = auVar95._8_4_;
        fVar199 = auVar95._12_4_;
        fVar210 = (auVar123._0_4_ - (float)local_58._4_4_) * fVar103 + (float)local_58._4_4_;
        fVar211 = (auVar123._4_4_ - (float)local_58._4_4_) * fVar116 + (float)local_58._4_4_;
        fVar220 = (auVar123._8_4_ - (float)local_58._4_4_) * fVar118 + (float)local_58._4_4_;
        fVar221 = (auVar123._12_4_ - (float)local_58._4_4_) * fVar120 + (float)local_58._4_4_;
        fVar277 = auVar214._0_4_;
        fVar279 = auVar214._4_4_;
        fVar286 = auVar214._8_4_;
        fVar289 = auVar214._12_4_;
        auVar69._0_4_ = (float)local_58._4_4_ * fVar277 - fVar200 * fVar229 * fVar190;
        auVar69._4_4_ = (float)local_58._4_4_ * fVar279 - fVar201 * fVar236 * fVar191;
        auVar69._8_4_ = (float)local_58._4_4_ * fVar286 - fVar208 * fVar241 * fVar198;
        auVar69._12_4_ = (float)local_58._4_4_ * fVar289 - fVar209 * fVar246 * fVar199;
        fVar292 = (auVar224._0_4_ - fVar52) * fVar103 + fVar52;
        fVar287 = (auVar224._4_4_ - fVar52) * fVar116 + fVar52;
        fVar290 = (auVar224._8_4_ - fVar52) * fVar118 + fVar52;
        fVar293 = (auVar224._12_4_ - fVar52) * fVar120 + fVar52;
        fVar200 = (auVar109._0_4_ - fVar234) * fVar103 + fVar234;
        fVar201 = (auVar109._4_4_ - fVar234) * fVar116 + fVar234;
        fVar208 = (auVar109._8_4_ - fVar234) * fVar118 + fVar234;
        fVar209 = (auVar109._12_4_ - fVar234) * fVar120 + fVar234;
        auVar111._0_4_ = fVar200 * fVar200 + fVar292 * fVar292 + fVar210 * fVar210;
        auVar111._4_4_ = fVar201 * fVar201 + fVar287 * fVar287 + fVar211 * fVar211;
        auVar111._8_4_ = fVar208 * fVar208 + fVar290 * fVar290 + fVar220 * fVar220;
        auVar111._12_4_ = fVar209 * fVar209 + fVar293 * fVar293 + fVar221 * fVar221;
        fVar247 = (auVar157._0_4_ - fVar58) * fVar103 + fVar58;
        fVar264 = (auVar157._4_4_ - fVar58) * fVar116 + fVar58;
        fVar273 = (auVar157._8_4_ - fVar58) * fVar118 + fVar58;
        fVar275 = (auVar157._12_4_ - fVar58) * fVar120 + fVar58;
        auVar159._0_4_ = fVar247 * fVar247 + auVar111._0_4_;
        auVar159._4_4_ = fVar264 * fVar264 + auVar111._4_4_;
        auVar159._8_4_ = fVar273 * fVar273 + auVar111._8_4_;
        auVar159._12_4_ = fVar275 * fVar275 + auVar111._12_4_;
        auVar106 = rsqrtps(auVar111,auVar159);
        fVar121 = auVar106._0_4_;
        fVar155 = auVar106._4_4_;
        fVar188 = auVar106._8_4_;
        fVar189 = auVar106._12_4_;
        fVar121 = fVar121 * 1.5 - fVar121 * fVar121 * auVar159._0_4_ * 0.5 * fVar121;
        fVar155 = fVar155 * 1.5 - fVar155 * fVar155 * auVar159._4_4_ * 0.5 * fVar155;
        fVar188 = fVar188 * 1.5 - fVar188 * fVar188 * auVar159._8_4_ * 0.5 * fVar188;
        fVar189 = fVar189 * 1.5 - fVar189 * fVar189 * auVar159._12_4_ * 0.5 * fVar189;
        auVar216._0_4_ = fVar210 * fVar121;
        auVar216._4_4_ = fVar211 * fVar155;
        auVar216._8_4_ = fVar220 * fVar188;
        auVar216._12_4_ = fVar221 * fVar189;
        auVar38._4_4_ = -(uint)(0.9995 < fVar233);
        auVar38._0_4_ = -(uint)(0.9995 < fVar222);
        auVar38._8_4_ = -(uint)(0.9995 < fVar239);
        auVar38._12_4_ = -(uint)(0.9995 < fVar245);
        auVar106 = blendvps(auVar69,auVar216,auVar38);
        auVar217._0_4_ = fVar52 * fVar277 - fVar93 * fVar229 * fVar190;
        auVar217._4_4_ = fVar52 * fVar279 - fVar100 * fVar236 * fVar191;
        auVar217._8_4_ = fVar52 * fVar286 - fVar237 * fVar241 * fVar198;
        auVar217._12_4_ = fVar52 * fVar289 - fVar72 * fVar246 * fVar199;
        auVar283._0_4_ = fVar292 * fVar121;
        auVar283._4_4_ = fVar287 * fVar155;
        auVar283._8_4_ = fVar290 * fVar188;
        auVar283._12_4_ = fVar293 * fVar189;
        auVar95 = blendvps(auVar217,auVar283,auVar38);
        auVar225._0_4_ = fVar234 * fVar277 - fVar117 * fVar229 * fVar190;
        auVar225._4_4_ = fVar234 * fVar279 - fVar73 * fVar236 * fVar191;
        auVar225._8_4_ = fVar234 * fVar286 - fVar74 * fVar241 * fVar198;
        auVar225._12_4_ = fVar234 * fVar289 - fVar119 * fVar246 * fVar199;
        auVar195._0_4_ = fVar200 * fVar121;
        auVar195._4_4_ = fVar201 * fVar155;
        auVar195._8_4_ = fVar208 * fVar188;
        auVar195._12_4_ = fVar209 * fVar189;
        auVar109 = blendvps(auVar225,auVar195,auVar38);
        local_1e8._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar13->l).vx.field_0,0);
        auVar269._0_4_ = fVar277 * fVar58 - fVar229 * local_68 * fVar190;
        auVar269._4_4_ = fVar279 * fVar58 - fVar236 * fStack_64 * fVar191;
        auVar269._8_4_ = fVar286 * fVar58 - fVar241 * fStack_60 * fVar198;
        auVar269._12_4_ = fVar289 * fVar58 - fVar246 * fStack_5c * fVar199;
        auVar203._0_4_ = fVar121 * fVar247;
        auVar203._4_4_ = fVar155 * fVar264;
        auVar203._8_4_ = fVar188 * fVar273;
        auVar203._12_4_ = fVar189 * fVar275;
        auVar123 = blendvps(auVar269,auVar203,auVar38);
        local_108._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,0);
        fVar52 = 1.0 - fVar103;
        fVar93 = 1.0 - fVar116;
        fVar100 = 1.0 - fVar118;
        fVar234 = 1.0 - fVar120;
        fVar191 = (float)local_1e8._0_4_ * fVar52 + (float)local_108._0_4_ * fVar103;
        fVar198 = (float)local_1e8._0_4_ * fVar93 + (float)local_108._0_4_ * fVar116;
        fVar199 = (float)local_1e8._0_4_ * fVar100 + (float)local_108._0_4_ * fVar118;
        fVar200 = (float)local_1e8._0_4_ * fVar234 + (float)local_108._0_4_ * fVar120;
        local_d8._4_4_ = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,4);
        local_248._4_4_ = fVar28 * fVar93 + (float)local_d8._4_4_ * fVar116;
        local_248._0_4_ = fVar28 * fVar52 + (float)local_d8._4_4_ * fVar103;
        uStack_240._0_4_ = fVar28 * fVar100 + (float)local_d8._4_4_ * fVar118;
        uStack_240._4_4_ = fVar28 * fVar234 + (float)local_d8._4_4_ * fVar120;
        fStack_c0 = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,8);
        local_238._4_4_ = fVar49 * fVar93 + fStack_c0 * fVar116;
        local_238._0_4_ = fVar49 * fVar52 + fStack_c0 * fVar103;
        uStack_230._0_4_ = fVar49 * fVar100 + fStack_c0 * fVar118;
        uStack_230._4_4_ = fVar49 * fVar234 + fStack_c0 * fVar120;
        local_188._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar4->field_0,0);
        local_138 = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,0);
        fVar28 = (float)local_188._0_4_ * fVar100;
        fVar49 = (float)local_188._0_4_ * fVar234;
        local_188._4_4_ = (float)local_188._0_4_ * fVar93 + local_138 * fVar116;
        local_188._0_4_ = (float)local_188._0_4_ * fVar52 + local_138 * fVar103;
        fStack_180 = fVar28 + local_138 * fVar118;
        fStack_17c = fVar49 + local_138 * fVar120;
        fStack_124 = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,4);
        local_1d8._4_4_ = fVar101 * fVar93 + fStack_124 * fVar116;
        local_1d8._0_4_ = fVar101 * fVar52 + fStack_124 * fVar103;
        fStack_1d0 = fVar101 * fVar100 + fStack_124 * fVar118;
        fStack_1cc = fVar101 * fVar234 + fStack_124 * fVar120;
        fStack_160 = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,8);
        local_228._4_4_ = fVar102 * fVar93 + fStack_160 * fVar116;
        local_228._0_4_ = fVar102 * fVar52 + fStack_160 * fVar103;
        uStack_220._0_4_ = fVar102 * fVar100 + fStack_160 * fVar118;
        uStack_220._4_4_ = fVar102 * fVar234 + fStack_160 * fVar120;
        local_1f8._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar6->field_0,0);
        local_118 = SUB124(*(undefined1 (*) [12])&pVVar7->field_0,0);
        fVar28 = (float)local_1f8._0_4_ * fVar100;
        fVar49 = (float)local_1f8._0_4_ * fVar234;
        local_1f8._4_4_ = (float)local_1f8._0_4_ * fVar93 + local_118 * fVar116;
        local_1f8._0_4_ = (float)local_1f8._0_4_ * fVar52 + local_118 * fVar103;
        uStack_1f0._0_4_ = fVar28 + local_118 * fVar118;
        uStack_1f0._4_4_ = fVar49 + local_118 * fVar120;
        local_f8._4_4_ = SUB124(*(undefined1 (*) [12])&pVVar7->field_0,4);
        local_1b8._4_4_ = fVar240 * fVar93 + (float)local_f8._4_4_ * fVar116;
        local_1b8._0_4_ = fVar240 * fVar52 + (float)local_f8._4_4_ * fVar103;
        fStack_1b0 = fVar240 * fVar100 + (float)local_f8._4_4_ * fVar118;
        fStack_1ac = fVar240 * fVar234 + (float)local_f8._4_4_ * fVar120;
        fStack_e0 = SUB124(*(undefined1 (*) [12])&pVVar7->field_0,8);
        local_1c8._4_4_ = fVar104 * fVar93 + fStack_e0 * fVar116;
        local_1c8._0_4_ = fVar104 * fVar52 + fStack_e0 * fVar103;
        fStack_1c0 = fVar104 * fVar100 + fStack_e0 * fVar118;
        fStack_1bc = fVar104 * fVar234 + fStack_e0 * fVar120;
        local_148._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,0);
        local_a8._4_4_ = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,4);
        fStack_b0 = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,8);
        local_198._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar2->field_0,0);
        fVar28 = (float)local_198._0_4_ * fVar100;
        fVar49 = (float)local_198._0_4_ * fVar234;
        local_198._4_4_ = (float)local_198._0_4_ * fVar93 + (float)local_148._0_4_ * fVar116;
        local_198._0_4_ = (float)local_198._0_4_ * fVar52 + (float)local_148._0_4_ * fVar103;
        fStack_190 = fVar28 + (float)local_148._0_4_ * fVar118;
        fStack_18c = fVar49 + (float)local_148._0_4_ * fVar120;
        local_1a8._4_4_ = fVar55 * fVar93 + (float)local_a8._4_4_ * fVar116;
        local_1a8._0_4_ = fVar55 * fVar52 + (float)local_a8._4_4_ * fVar103;
        fStack_1a0 = fVar55 * fVar100 + (float)local_a8._4_4_ * fVar118;
        fStack_19c = fVar55 * fVar234 + (float)local_a8._4_4_ * fVar120;
        local_158._4_4_ = fVar93 * fVar192 + fStack_b0 * fVar116;
        local_158._0_4_ = fVar52 * fVar192 + fStack_b0 * fVar103;
        fStack_150 = fVar100 * fVar192 + fStack_b0 * fVar118;
        fStack_14c = fVar234 * fVar192 + fStack_b0 * fVar120;
        fVar201 = auVar95._0_4_;
        fVar208 = auVar95._4_4_;
        fVar209 = auVar95._8_4_;
        fVar210 = auVar95._12_4_;
        fVar264 = auVar109._0_4_;
        fVar273 = auVar109._4_4_;
        fVar275 = auVar109._8_4_;
        fVar277 = auVar109._12_4_;
        fVar103 = auVar106._0_4_;
        fVar116 = auVar106._4_4_;
        fVar118 = auVar106._8_4_;
        fVar120 = auVar106._12_4_;
        fVar28 = auVar123._0_4_;
        fVar49 = auVar123._4_4_;
        fVar52 = auVar123._8_4_;
        fVar55 = auVar123._12_4_;
        fVar102 = fVar201 * fVar264 + fVar103 * fVar28;
        fVar234 = fVar208 * fVar273 + fVar116 * fVar49;
        fVar237 = fVar209 * fVar275 + fVar118 * fVar52;
        fVar240 = fVar210 * fVar277 + fVar120 * fVar55;
        fVar229 = fVar201 * fVar264 - fVar103 * fVar28;
        fVar233 = fVar208 * fVar273 - fVar116 * fVar49;
        fVar236 = fVar209 * fVar275 - fVar118 * fVar52;
        fVar239 = fVar210 * fVar277 - fVar120 * fVar55;
        fVar192 = fVar103 * fVar103 - fVar201 * fVar201;
        fVar93 = fVar116 * fVar116 - fVar208 * fVar208;
        fVar100 = fVar118 * fVar118 - fVar209 * fVar209;
        fVar101 = fVar120 * fVar120 - fVar210 * fVar210;
        fVar155 = fVar201 * fVar28 - fVar103 * fVar264;
        fVar188 = fVar208 * fVar49 - fVar116 * fVar273;
        fVar189 = fVar209 * fVar52 - fVar118 * fVar275;
        fVar190 = fVar210 * fVar55 - fVar120 * fVar277;
        fVar104 = fVar103 * fVar264 + fVar201 * fVar28;
        fVar72 = fVar116 * fVar273 + fVar208 * fVar49;
        fVar73 = fVar118 * fVar275 + fVar209 * fVar52;
        fVar119 = fVar120 * fVar277 + fVar210 * fVar55;
        fVar211 = fVar28 * fVar264 + fVar201 * fVar103;
        fVar220 = fVar49 * fVar273 + fVar208 * fVar116;
        fVar221 = fVar52 * fVar275 + fVar209 * fVar118;
        fVar222 = fVar55 * fVar277 + fVar210 * fVar120;
        fVar58 = fVar28 * fVar264 - fVar201 * fVar103;
        fVar117 = fVar49 * fVar273 - fVar208 * fVar116;
        fVar74 = fVar52 * fVar275 - fVar209 * fVar118;
        fVar121 = fVar55 * fVar277 - fVar210 * fVar120;
        fVar264 = fVar264 * fVar264;
        fVar273 = fVar273 * fVar273;
        fVar275 = fVar275 * fVar275;
        fVar277 = fVar277 * fVar277;
        fVar28 = fVar28 * fVar28;
        fVar49 = fVar49 * fVar49;
        fVar52 = fVar52 * fVar52;
        fVar55 = fVar55 * fVar55;
        fVar241 = ((fVar103 * fVar103 + fVar201 * fVar201) - fVar264) - fVar28;
        fVar245 = ((fVar116 * fVar116 + fVar208 * fVar208) - fVar273) - fVar49;
        fVar246 = ((fVar118 * fVar118 + fVar209 * fVar209) - fVar275) - fVar52;
        fVar247 = ((fVar120 * fVar120 + fVar210 * fVar210) - fVar277) - fVar55;
        fVar103 = (fVar264 + fVar192) - fVar28;
        fVar116 = (fVar273 + fVar93) - fVar49;
        fVar118 = (fVar275 + fVar100) - fVar52;
        fVar120 = (fVar277 + fVar101) - fVar55;
        fVar28 = (fVar192 - fVar264) + fVar28;
        fVar49 = (fVar93 - fVar273) + fVar49;
        fVar52 = (fVar100 - fVar275) + fVar52;
        fVar55 = (fVar101 - fVar277) + fVar55;
      }
      else {
        if (uVar26 != 0) {
          pAVar13 = pIVar9->local2world;
          auVar95 = local_48;
          do {
            lVar14 = 0;
            if ((uVar26 & 0xf) != 0) {
              for (; ((uVar26 & 0xf) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
              }
            }
            iVar8 = *(int *)((long)&local_98 + (long)(int)lVar14 * 4);
            auVar267._0_4_ = -(uint)(iVar8 == iVar228);
            auVar267._4_4_ = -(uint)(iVar8 == iVar232);
            auVar267._8_4_ = -(uint)(iVar8 == iVar235);
            auVar267._12_4_ = -(uint)(iVar8 == iVar238);
            auVar267 = auVar267 & auVar95;
            pAVar11 = pAVar13 + iVar8;
            uVar15 = *(undefined4 *)&(pAVar11->l).vx.field_0;
            uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
            uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
            uVar18 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 0xc);
            auVar162._4_4_ = uVar15;
            auVar162._0_4_ = uVar15;
            auVar162._8_4_ = uVar15;
            auVar162._12_4_ = uVar15;
            _local_1e8 = blendvps(_local_1e8,auVar162,auVar267);
            auVar163._4_4_ = uVar16;
            auVar163._0_4_ = uVar16;
            auVar163._8_4_ = uVar16;
            auVar163._12_4_ = uVar16;
            _local_248 = blendvps(_local_248,auVar163,auVar267);
            auVar164._4_4_ = uVar17;
            auVar164._0_4_ = uVar17;
            auVar164._8_4_ = uVar17;
            auVar164._12_4_ = uVar17;
            _local_238 = blendvps(_local_238,auVar164,auVar267);
            auVar139._4_4_ = uVar18;
            auVar139._0_4_ = uVar18;
            auVar139._8_4_ = uVar18;
            auVar139._12_4_ = uVar18;
            in_XMM11 = blendvps(in_XMM11,auVar139,auVar267);
            pVVar2 = &pAVar13[iVar8].l.vy;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar165._4_4_ = uVar15;
            auVar165._0_4_ = uVar15;
            auVar165._8_4_ = uVar15;
            auVar165._12_4_ = uVar15;
            _local_188 = blendvps(_local_188,auVar165,auVar267);
            auVar166._4_4_ = uVar16;
            auVar166._0_4_ = uVar16;
            auVar166._8_4_ = uVar16;
            auVar166._12_4_ = uVar16;
            _local_1d8 = blendvps(_local_1d8,auVar166,auVar267);
            auVar167._4_4_ = uVar17;
            auVar167._0_4_ = uVar17;
            auVar167._8_4_ = uVar17;
            auVar167._12_4_ = uVar17;
            _local_228 = blendvps(_local_228,auVar167,auVar267);
            auVar140._4_4_ = uVar18;
            auVar140._0_4_ = uVar18;
            auVar140._8_4_ = uVar18;
            auVar140._12_4_ = uVar18;
            in_XMM15 = blendvps(in_XMM15,auVar140,auVar267);
            pVVar2 = &pAVar13[iVar8].l.vz;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar168._4_4_ = uVar15;
            auVar168._0_4_ = uVar15;
            auVar168._8_4_ = uVar15;
            auVar168._12_4_ = uVar15;
            _local_1f8 = blendvps(_local_1f8,auVar168,auVar267);
            auVar169._4_4_ = uVar16;
            auVar169._0_4_ = uVar16;
            auVar169._8_4_ = uVar16;
            auVar169._12_4_ = uVar16;
            _local_1b8 = blendvps(_local_1b8,auVar169,auVar267);
            auVar170._4_4_ = uVar17;
            auVar170._0_4_ = uVar17;
            auVar170._8_4_ = uVar17;
            auVar170._12_4_ = uVar17;
            _local_1c8 = blendvps(_local_1c8,auVar170,auVar267);
            auVar141._4_4_ = uVar18;
            auVar141._0_4_ = uVar18;
            auVar141._8_4_ = uVar18;
            auVar141._12_4_ = uVar18;
            in_XMM12 = blendvps(in_XMM12,auVar141,auVar267);
            pVVar2 = &pAVar13[iVar8].p;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar171._4_4_ = uVar15;
            auVar171._0_4_ = uVar15;
            auVar171._8_4_ = uVar15;
            auVar171._12_4_ = uVar15;
            _local_198 = blendvps(_local_198,auVar171,auVar267);
            auVar172._4_4_ = uVar16;
            auVar172._0_4_ = uVar16;
            auVar172._8_4_ = uVar16;
            auVar172._12_4_ = uVar16;
            _local_1a8 = blendvps(_local_1a8,auVar172,auVar267);
            auVar173._4_4_ = uVar17;
            auVar173._0_4_ = uVar17;
            auVar173._8_4_ = uVar17;
            auVar173._12_4_ = uVar17;
            _local_258 = blendvps(_local_258,auVar173,auVar267);
            auVar142._4_4_ = uVar18;
            auVar142._0_4_ = uVar18;
            auVar142._8_4_ = uVar18;
            auVar142._12_4_ = uVar18;
            auVar106 = blendvps(auVar106,auVar142,auVar267);
            pAVar11 = pAVar13 + (long)iVar8 + 1;
            uVar15 = *(undefined4 *)&(pAVar11->l).vx.field_0;
            uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
            uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
            uVar18 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 0xc);
            auVar174._4_4_ = uVar15;
            auVar174._0_4_ = uVar15;
            auVar174._8_4_ = uVar15;
            auVar174._12_4_ = uVar15;
            in_XMM10 = blendvps(in_XMM10,auVar174,auVar267);
            auVar175._4_4_ = uVar16;
            auVar175._0_4_ = uVar16;
            auVar175._8_4_ = uVar16;
            auVar175._12_4_ = uVar16;
            _local_108 = blendvps(_local_108,auVar175,auVar267);
            auVar176._4_4_ = uVar17;
            auVar176._0_4_ = uVar17;
            auVar176._8_4_ = uVar17;
            auVar176._12_4_ = uVar17;
            _local_f8 = blendvps(_local_f8,auVar176,auVar267);
            auVar143._4_4_ = uVar18;
            auVar143._0_4_ = uVar18;
            auVar143._8_4_ = uVar18;
            auVar143._12_4_ = uVar18;
            in_XMM4 = blendvps(in_XMM4,auVar143,auVar267);
            pVVar2 = &pAVar13[(long)iVar8 + 1].l.vy;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar177._4_4_ = uVar15;
            auVar177._0_4_ = uVar15;
            auVar177._8_4_ = uVar15;
            auVar177._12_4_ = uVar15;
            _local_e8 = blendvps(_local_e8,auVar177,auVar267);
            auVar178._4_4_ = uVar16;
            auVar178._0_4_ = uVar16;
            auVar178._8_4_ = uVar16;
            auVar178._12_4_ = uVar16;
            _local_d8 = blendvps(_local_d8,auVar178,auVar267);
            auVar179._4_4_ = uVar17;
            auVar179._0_4_ = uVar17;
            auVar179._8_4_ = uVar17;
            auVar179._12_4_ = uVar17;
            _local_c8 = blendvps(_local_c8,auVar179,auVar267);
            auVar144._4_4_ = uVar18;
            auVar144._0_4_ = uVar18;
            auVar144._8_4_ = uVar18;
            auVar144._12_4_ = uVar18;
            auVar123 = blendvps(auVar123,auVar144,auVar267);
            pVVar2 = &pAVar13[(long)iVar8 + 1].l.vz;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar180._4_4_ = uVar15;
            auVar180._0_4_ = uVar15;
            auVar180._8_4_ = uVar15;
            auVar180._12_4_ = uVar15;
            _local_b8 = blendvps(_local_b8,auVar180,auVar267);
            auVar181._4_4_ = uVar16;
            auVar181._0_4_ = uVar16;
            auVar181._8_4_ = uVar16;
            auVar181._12_4_ = uVar16;
            _local_a8 = blendvps(_local_a8,auVar181,auVar267);
            auVar182._4_4_ = uVar17;
            auVar182._0_4_ = uVar17;
            auVar182._8_4_ = uVar17;
            auVar182._12_4_ = uVar17;
            _local_148 = blendvps(_local_148,auVar182,auVar267);
            auVar145._4_4_ = uVar18;
            auVar145._0_4_ = uVar18;
            auVar145._8_4_ = uVar18;
            auVar145._12_4_ = uVar18;
            in_XMM13 = blendvps(in_XMM13,auVar145,auVar267);
            pVVar2 = &pAVar13[(long)iVar8 + 1].p;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar183._4_4_ = uVar15;
            auVar183._0_4_ = uVar15;
            auVar183._8_4_ = uVar15;
            auVar183._12_4_ = uVar15;
            _local_158 = blendvps(_local_158,auVar183,auVar267);
            auVar184._4_4_ = uVar16;
            auVar184._0_4_ = uVar16;
            auVar184._8_4_ = uVar16;
            auVar184._12_4_ = uVar16;
            _local_208 = blendvps(_local_208,auVar184,auVar267);
            auVar185._4_4_ = uVar17;
            auVar185._0_4_ = uVar17;
            auVar185._8_4_ = uVar17;
            auVar185._12_4_ = uVar17;
            _local_218 = blendvps(_local_218,auVar185,auVar267);
            auVar146._4_4_ = uVar18;
            auVar146._0_4_ = uVar18;
            auVar146._8_4_ = uVar18;
            auVar146._12_4_ = uVar18;
            auVar109 = blendvps(auVar109,auVar146,auVar267);
            auVar95 = auVar95 ^ auVar267;
            uVar26 = movmskps(iVar8 * 0x40,auVar95);
          } while (uVar26 != 0);
        }
        fVar28 = auVar106._0_4_;
        fVar52 = auVar106._4_4_;
        fVar192 = auVar106._8_4_;
        fVar100 = auVar106._12_4_;
        fVar201 = in_XMM11._0_4_;
        fVar209 = in_XMM11._4_4_;
        fVar211 = in_XMM11._8_4_;
        fVar221 = in_XMM11._12_4_;
        fVar264 = in_XMM15._0_4_;
        fVar275 = in_XMM15._4_4_;
        fVar279 = in_XMM15._8_4_;
        fVar289 = in_XMM15._12_4_;
        fVar229 = in_XMM12._0_4_;
        fVar233 = in_XMM12._4_4_;
        fVar236 = in_XMM12._8_4_;
        fVar239 = in_XMM12._12_4_;
        auVar186._0_4_ =
             in_XMM13._0_4_ * fVar229 +
             auVar123._0_4_ * fVar264 + in_XMM4._0_4_ * fVar201 + auVar109._0_4_ * fVar28;
        auVar186._4_4_ =
             in_XMM13._4_4_ * fVar233 +
             auVar123._4_4_ * fVar275 + in_XMM4._4_4_ * fVar209 + auVar109._4_4_ * fVar52;
        auVar186._8_4_ =
             in_XMM13._8_4_ * fVar236 +
             auVar123._8_4_ * fVar279 + in_XMM4._8_4_ * fVar211 + auVar109._8_4_ * fVar192;
        auVar186._12_4_ =
             in_XMM13._12_4_ * fVar239 +
             auVar123._12_4_ * fVar289 + in_XMM4._12_4_ * fVar221 + auVar109._12_4_ * fVar100;
        uVar19 = CONCAT44(auVar186._4_4_,auVar186._0_4_);
        auVar285._0_8_ = uVar19 ^ 0x8000000080000000;
        auVar285._8_4_ = -auVar186._8_4_;
        auVar285._12_4_ = -auVar186._12_4_;
        auVar40._4_4_ = -(uint)(auVar186._4_4_ < -auVar186._4_4_);
        auVar40._0_4_ = -(uint)(auVar186._0_4_ < -auVar186._0_4_);
        auVar40._8_4_ = -(uint)(auVar186._8_4_ < auVar285._8_4_);
        auVar40._12_4_ = -(uint)(auVar186._12_4_ < auVar285._12_4_);
        auVar147._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
        auVar147._8_4_ = -auVar109._8_4_;
        auVar147._12_4_ = -auVar109._12_4_;
        auVar106 = blendvps(auVar109,auVar147,auVar40);
        auVar148._0_8_ = in_XMM4._0_8_ ^ 0x8000000080000000;
        auVar148._8_4_ = -in_XMM4._8_4_;
        auVar148._12_4_ = -in_XMM4._12_4_;
        auVar109 = blendvps(in_XMM4,auVar148,auVar40);
        auVar149._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
        auVar149._8_4_ = -auVar123._8_4_;
        auVar149._12_4_ = -auVar123._12_4_;
        auVar95 = blendvps(auVar123,auVar149,auVar40);
        auVar150._0_8_ = in_XMM13._0_8_ ^ 0x8000000080000000;
        auVar150._8_4_ = -in_XMM13._8_4_;
        auVar150._12_4_ = -in_XMM13._12_4_;
        auVar157 = blendvps(in_XMM13,auVar150,auVar40);
        auVar214 = maxps(auVar285,auVar186);
        fVar49 = ABS(auVar186._0_4_);
        fVar55 = ABS(auVar186._4_4_);
        uVar19 = CONCAT44(auVar186._4_4_,auVar186._0_4_);
        auVar187._0_8_ = uVar19 & 0x7fffffff7fffffff;
        auVar187._8_4_ = ABS(auVar186._8_4_);
        auVar187._12_4_ = ABS(auVar186._12_4_);
        auVar151._0_4_ = 1.0 - fVar49;
        auVar151._4_4_ = 1.0 - fVar55;
        auVar151._8_4_ = 1.0 - auVar187._8_4_;
        auVar151._12_4_ = 1.0 - auVar187._12_4_;
        auVar123 = sqrtps(auVar151,auVar151);
        auVar41._0_4_ =
             1.5707964 -
             auVar123._0_4_ *
             (((((fVar49 * -0.0043095737 + 0.0192803) * fVar49 + -0.04489909) * fVar49 + 0.08785567)
               * fVar49 + -0.21450998) * fVar49 + 1.5707952);
        auVar41._4_4_ =
             1.5707964 -
             auVar123._4_4_ *
             (((((fVar55 * -0.0043095737 + 0.0192803) * fVar55 + -0.04489909) * fVar55 + 0.08785567)
               * fVar55 + -0.21450998) * fVar55 + 1.5707952);
        auVar41._8_4_ =
             1.5707964 -
             auVar123._8_4_ *
             (((((auVar187._8_4_ * -0.0043095737 + 0.0192803) * auVar187._8_4_ + -0.04489909) *
                auVar187._8_4_ + 0.08785567) * auVar187._8_4_ + -0.21450998) * auVar187._8_4_ +
             1.5707952);
        auVar41._12_4_ =
             1.5707964 -
             auVar123._12_4_ *
             (((((auVar187._12_4_ * -0.0043095737 + 0.0192803) * auVar187._12_4_ + -0.04489909) *
                auVar187._12_4_ + 0.08785567) * auVar187._12_4_ + -0.21450998) * auVar187._12_4_ +
             1.5707952);
        auVar123 = maxps(ZEXT816(0),auVar41);
        fVar273 = auVar214._0_4_;
        fVar277 = auVar214._4_4_;
        fVar286 = auVar214._8_4_;
        fVar292 = auVar214._12_4_;
        auVar42._4_4_ = -(uint)(fVar277 < 0.0);
        auVar42._0_4_ = -(uint)(fVar273 < 0.0);
        auVar42._8_4_ = -(uint)(fVar286 < 0.0);
        auVar42._12_4_ = -(uint)(fVar292 < 0.0);
        auVar152._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
        auVar152._8_4_ = auVar123._8_4_ ^ 0x80000000;
        auVar152._12_4_ = auVar123._12_4_ ^ 0x80000000;
        auVar123 = blendvps(auVar123,auVar152,auVar42);
        auVar153._0_4_ = 1.5707964 - auVar123._0_4_;
        auVar153._4_4_ = 1.5707964 - auVar123._4_4_;
        auVar153._8_4_ = 1.5707964 - auVar123._8_4_;
        auVar153._12_4_ = 1.5707964 - auVar123._12_4_;
        auVar43._4_4_ = -(uint)(1.0 < fVar55);
        auVar43._0_4_ = -(uint)(1.0 < fVar49);
        auVar43._8_4_ = -(uint)(1.0 < auVar187._8_4_);
        auVar43._12_4_ = -(uint)(1.0 < auVar187._12_4_);
        auVar123 = blendvps(auVar153,_DAT_01ff1c40,auVar43);
        fVar49 = auVar123._0_4_ * fVar103;
        fVar55 = auVar123._4_4_ * fVar116;
        fVar93 = auVar123._8_4_ * fVar118;
        fVar101 = auVar123._12_4_ * fVar120;
        auVar44._0_4_ = fVar49 * 0.63661975;
        auVar44._4_4_ = fVar55 * 0.63661975;
        auVar44._8_4_ = fVar93 * 0.63661975;
        auVar44._12_4_ = fVar101 * 0.63661975;
        auVar123 = roundps(auVar187,auVar44,1);
        uVar53 = (uint)auVar123._0_4_;
        uVar54 = (uint)auVar123._4_4_;
        uVar56 = (uint)auVar123._8_4_;
        uVar57 = (uint)auVar123._12_4_;
        auVar154._0_4_ = fVar49 - auVar123._0_4_ * 1.5707964;
        auVar154._4_4_ = fVar55 - auVar123._4_4_ * 1.5707964;
        auVar154._8_4_ = fVar93 - auVar123._8_4_ * 1.5707964;
        auVar154._12_4_ = fVar101 - auVar123._12_4_ * 1.5707964;
        uVar26 = uVar53 & 3;
        uVar29 = uVar54 & 3;
        uVar50 = uVar56 & 3;
        uVar51 = uVar57 & 3;
        fVar49 = auVar154._0_4_ * auVar154._0_4_;
        fVar55 = auVar154._4_4_ * auVar154._4_4_;
        fVar93 = auVar154._8_4_ * auVar154._8_4_;
        fVar101 = auVar154._12_4_ * auVar154._12_4_;
        uVar53 = uVar53 & 1;
        uVar54 = uVar54 & 1;
        uVar56 = uVar56 & 1;
        uVar57 = uVar57 & 1;
        local_168._4_4_ = -(uint)(uVar54 == 0);
        local_168._0_4_ = -(uint)(uVar53 == 0);
        fStack_160 = (float)-(uint)(uVar56 == 0);
        fStack_15c = (float)-(uint)(uVar57 == 0);
        auVar256._4_4_ = -uVar54;
        auVar256._0_4_ = -uVar53;
        auVar256._8_4_ = -uVar56;
        auVar256._12_4_ = -uVar57;
        auVar271._0_8_ =
             CONCAT44((((((fVar55 * -2.5029328e-08 + 2.7600126e-06) * fVar55 + -0.00019842605) *
                         fVar55 + 0.008333348) * fVar55 + -0.16666667) * fVar55 + 1.0) *
                      auVar154._4_4_,
                      (((((fVar49 * -2.5029328e-08 + 2.7600126e-06) * fVar49 + -0.00019842605) *
                         fVar49 + 0.008333348) * fVar49 + -0.16666667) * fVar49 + 1.0) *
                      auVar154._0_4_);
        auVar271._8_4_ =
             (((((fVar93 * -2.5029328e-08 + 2.7600126e-06) * fVar93 + -0.00019842605) * fVar93 +
               0.008333348) * fVar93 + -0.16666667) * fVar93 + 1.0) * auVar154._8_4_;
        auVar271._12_4_ =
             (((((fVar101 * -2.5029328e-08 + 2.7600126e-06) * fVar101 + -0.00019842605) * fVar101 +
               0.008333348) * fVar101 + -0.16666667) * fVar101 + 1.0) * auVar154._12_4_;
        auVar206._0_4_ =
             ((((fVar49 * -2.5963018e-07 + 2.4756235e-05) * fVar49 + -0.001388833) * fVar49 +
              0.04166664) * fVar49 + -0.5) * fVar49 + 1.0;
        auVar206._4_4_ =
             ((((fVar55 * -2.5963018e-07 + 2.4756235e-05) * fVar55 + -0.001388833) * fVar55 +
              0.04166664) * fVar55 + -0.5) * fVar55 + 1.0;
        auVar206._8_4_ =
             ((((fVar93 * -2.5963018e-07 + 2.4756235e-05) * fVar93 + -0.001388833) * fVar93 +
              0.04166664) * fVar93 + -0.5) * fVar93 + 1.0;
        auVar206._12_4_ =
             ((((fVar101 * -2.5963018e-07 + 2.4756235e-05) * fVar101 + -0.001388833) * fVar101 +
              0.04166664) * fVar101 + -0.5) * fVar101 + 1.0;
        auVar231._8_4_ = auVar271._8_4_;
        auVar231._0_8_ = auVar271._0_8_;
        auVar231._12_4_ = auVar271._12_4_;
        auVar123 = blendvps(auVar231,auVar206,auVar256);
        auVar224 = blendvps(auVar271,auVar206,_local_168);
        auVar214 = pmovsxbd(auVar256,0x1010101);
        uVar53 = auVar214._0_4_;
        auVar45._0_4_ = -(uint)((int)uVar53 < (int)uVar26);
        uVar54 = auVar214._4_4_;
        auVar45._4_4_ = -(uint)((int)uVar54 < (int)uVar29);
        uVar56 = auVar214._8_4_;
        auVar45._8_4_ = -(uint)((int)uVar56 < (int)uVar50);
        uVar57 = auVar214._12_4_;
        auVar45._12_4_ = -(uint)((int)uVar57 < (int)uVar51);
        auVar207._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
        auVar207._8_4_ = auVar123._8_4_ ^ 0x80000000;
        auVar207._12_4_ = auVar123._12_4_ ^ 0x80000000;
        local_38 = blendvps(auVar123,auVar207,auVar45);
        uVar26 = uVar26 - 1;
        uVar29 = uVar29 - 1;
        uVar50 = uVar50 - 1;
        uVar51 = uVar51 - 1;
        auVar257._0_4_ =
             -(uint)(((uVar26 < uVar53) * uVar26 | (uVar26 >= uVar53) * uVar53) == uVar26);
        auVar257._4_4_ =
             -(uint)(((uVar29 < uVar54) * uVar29 | (uVar29 >= uVar54) * uVar54) == uVar29);
        auVar257._8_4_ =
             -(uint)(((uVar50 < uVar56) * uVar50 | (uVar50 >= uVar56) * uVar56) == uVar50);
        auVar257._12_4_ =
             -(uint)(((uVar51 < uVar57) * uVar51 | (uVar51 >= uVar57) * uVar57) == uVar51);
        auVar244._0_8_ = auVar224._0_8_ ^ 0x8000000080000000;
        auVar244._8_4_ = auVar224._8_4_ ^ 0x80000000;
        auVar244._12_4_ = auVar224._12_4_ ^ 0x80000000;
        auVar214 = blendvps(auVar224,auVar244,auVar257);
        fVar102 = fVar28 * fVar273 - auVar106._0_4_;
        fVar234 = fVar52 * fVar277 - auVar106._4_4_;
        fVar237 = fVar192 * fVar286 - auVar106._8_4_;
        fVar240 = fVar100 * fVar292 - auVar106._12_4_;
        local_78._0_4_ = fVar201 * fVar273 - auVar109._0_4_;
        local_78._4_4_ = fVar209 * fVar277 - auVar109._4_4_;
        fStack_70 = fVar211 * fVar286 - auVar109._8_4_;
        fStack_6c = fVar221 * fVar292 - auVar109._12_4_;
        fVar191 = fVar264 * fVar273 - auVar95._0_4_;
        fVar198 = fVar275 * fVar277 - auVar95._4_4_;
        fVar199 = fVar279 * fVar286 - auVar95._8_4_;
        fVar200 = fVar289 * fVar292 - auVar95._12_4_;
        local_138 = auVar157._0_4_;
        fStack_134 = auVar157._4_4_;
        fStack_130 = auVar157._8_4_;
        fStack_12c = auVar157._12_4_;
        local_68 = fVar229 * fVar273 - local_138;
        fStack_64 = fVar233 * fVar277 - fStack_134;
        fStack_60 = fVar236 * fVar286 - fStack_130;
        fStack_5c = fVar239 * fVar292 - fStack_12c;
        auVar196._0_4_ =
             local_68 * local_68 +
             fVar191 * fVar191 + (float)local_78._0_4_ * (float)local_78._0_4_ + fVar102 * fVar102;
        auVar196._4_4_ =
             fStack_64 * fStack_64 +
             fVar198 * fVar198 + (float)local_78._4_4_ * (float)local_78._4_4_ + fVar234 * fVar234;
        auVar196._8_4_ =
             fStack_60 * fStack_60 + fVar199 * fVar199 + fStack_70 * fStack_70 + fVar237 * fVar237;
        auVar196._12_4_ =
             fStack_5c * fStack_5c + fVar200 * fVar200 + fStack_6c * fStack_6c + fVar240 * fVar240;
        auVar123 = rsqrtps(auVar154,auVar196);
        fVar49 = auVar123._0_4_;
        fVar55 = auVar123._4_4_;
        fVar93 = auVar123._8_4_;
        fVar101 = auVar123._12_4_;
        fVar155 = fVar49 * 1.5 - fVar49 * fVar49 * auVar196._0_4_ * 0.5 * fVar49;
        fVar188 = fVar55 * 1.5 - fVar55 * fVar55 * auVar196._4_4_ * 0.5 * fVar55;
        fVar189 = fVar93 * 1.5 - fVar93 * fVar93 * auVar196._8_4_ * 0.5 * fVar93;
        fVar190 = fVar101 * 1.5 - fVar101 * fVar101 * auVar196._12_4_ * 0.5 * fVar101;
        fVar208 = local_38._0_4_;
        fVar210 = local_38._4_4_;
        fVar220 = local_38._8_4_;
        fVar222 = local_38._12_4_;
        fVar241 = auVar214._0_4_;
        fVar245 = auVar214._4_4_;
        fVar246 = auVar214._8_4_;
        fVar247 = auVar214._12_4_;
        local_168._4_4_ = fVar52 * fVar245 - fVar234 * fVar188 * fVar210;
        local_168._0_4_ = fVar28 * fVar241 - fVar102 * fVar155 * fVar208;
        fStack_160 = fVar192 * fVar246 - fVar237 * fVar189 * fVar220;
        fStack_15c = fVar100 * fVar247 - fVar240 * fVar190 * fVar222;
        fVar28 = (auVar106._0_4_ - fVar28) * fVar103 + fVar28;
        fVar52 = (auVar106._4_4_ - fVar52) * fVar116 + fVar52;
        fVar192 = (auVar106._8_4_ - fVar192) * fVar118 + fVar192;
        fVar100 = (auVar106._12_4_ - fVar100) * fVar120 + fVar100;
        fVar104 = (auVar109._0_4_ - fVar201) * fVar103 + fVar201;
        fVar58 = (auVar109._4_4_ - fVar209) * fVar116 + fVar209;
        fVar72 = (auVar109._8_4_ - fVar211) * fVar118 + fVar211;
        fVar117 = (auVar109._12_4_ - fVar221) * fVar120 + fVar221;
        fVar102 = (auVar95._0_4_ - fVar264) * fVar103 + fVar264;
        fVar234 = (auVar95._4_4_ - fVar275) * fVar116 + fVar275;
        fVar237 = (auVar95._8_4_ - fVar279) * fVar118 + fVar279;
        fVar240 = (auVar95._12_4_ - fVar289) * fVar120 + fVar289;
        auVar70._0_4_ = fVar102 * fVar102 + fVar104 * fVar104 + fVar28 * fVar28;
        auVar70._4_4_ = fVar234 * fVar234 + fVar58 * fVar58 + fVar52 * fVar52;
        auVar70._8_4_ = fVar237 * fVar237 + fVar72 * fVar72 + fVar192 * fVar192;
        auVar70._12_4_ = fVar240 * fVar240 + fVar117 * fVar117 + fVar100 * fVar100;
        fVar73 = (local_138 - fVar229) * fVar103 + fVar229;
        fVar74 = (fStack_134 - fVar233) * fVar116 + fVar233;
        fVar119 = (fStack_130 - fVar236) * fVar118 + fVar236;
        fVar121 = (fStack_12c - fVar239) * fVar120 + fVar239;
        auVar46._0_4_ = fVar73 * fVar73 + auVar70._0_4_;
        auVar46._4_4_ = fVar74 * fVar74 + auVar70._4_4_;
        auVar46._8_4_ = fVar119 * fVar119 + auVar70._8_4_;
        auVar46._12_4_ = fVar121 * fVar121 + auVar70._12_4_;
        auVar106 = rsqrtps(auVar70,auVar46);
        fVar49 = auVar106._0_4_;
        fVar55 = auVar106._4_4_;
        fVar93 = auVar106._8_4_;
        fVar101 = auVar106._12_4_;
        fVar49 = fVar49 * 1.5 - fVar49 * fVar49 * auVar46._0_4_ * 0.5 * fVar49;
        fVar55 = fVar55 * 1.5 - fVar55 * fVar55 * auVar46._4_4_ * 0.5 * fVar55;
        fVar93 = fVar93 * 1.5 - fVar93 * fVar93 * auVar46._8_4_ * 0.5 * fVar93;
        fVar101 = fVar101 * 1.5 - fVar101 * fVar101 * auVar46._12_4_ * 0.5 * fVar101;
        auVar92._0_4_ = fVar28 * fVar49;
        auVar92._4_4_ = fVar52 * fVar55;
        auVar92._8_4_ = fVar192 * fVar93;
        auVar92._12_4_ = fVar100 * fVar101;
        uVar281 = CONCAT44(-(uint)(0.9995 < fVar277),-(uint)(0.9995 < fVar273));
        auVar47._8_4_ = -(uint)(0.9995 < fVar286);
        auVar47._0_8_ = uVar281;
        auVar47._12_4_ = -(uint)(0.9995 < fVar292);
        auVar106 = blendvps(_local_168,auVar92,auVar47);
        auVar71._0_4_ = fVar201 * fVar241 - (float)local_78._0_4_ * fVar155 * fVar208;
        auVar71._4_4_ = fVar209 * fVar245 - (float)local_78._4_4_ * fVar188 * fVar210;
        auVar71._8_4_ = fVar211 * fVar246 - fStack_70 * fVar189 * fVar220;
        auVar71._12_4_ = fVar221 * fVar247 - fStack_6c * fVar190 * fVar222;
        auVar114._0_4_ = fVar104 * fVar49;
        auVar114._4_4_ = fVar58 * fVar55;
        auVar114._8_4_ = fVar72 * fVar93;
        auVar114._12_4_ = fVar117 * fVar101;
        auVar48._8_4_ = -(uint)(0.9995 < fVar286);
        auVar48._0_8_ = uVar281;
        auVar48._12_4_ = -(uint)(0.9995 < fVar292);
        auVar95 = blendvps(auVar71,auVar114,auVar48);
        auVar115._0_4_ = fVar264 * fVar241 - fVar191 * fVar155 * fVar208;
        auVar115._4_4_ = fVar275 * fVar245 - fVar198 * fVar188 * fVar210;
        auVar115._8_4_ = fVar279 * fVar246 - fVar199 * fVar189 * fVar220;
        auVar115._12_4_ = fVar289 * fVar247 - fVar200 * fVar190 * fVar222;
        auVar99._0_4_ = fVar102 * fVar49;
        auVar99._4_4_ = fVar234 * fVar55;
        auVar99._8_4_ = fVar237 * fVar93;
        auVar99._12_4_ = fVar240 * fVar101;
        auVar109 = blendvps(auVar115,auVar99,auVar48);
        auVar272._0_4_ = fVar241 * fVar229 - fVar155 * local_68 * fVar208;
        auVar272._4_4_ = fVar245 * fVar233 - fVar188 * fStack_64 * fVar210;
        auVar272._8_4_ = fVar246 * fVar236 - fVar189 * fStack_60 * fVar220;
        auVar272._12_4_ = fVar247 * fVar239 - fVar190 * fStack_5c * fVar222;
        auVar197._0_4_ = fVar49 * fVar73;
        auVar197._4_4_ = fVar55 * fVar74;
        auVar197._8_4_ = fVar93 * fVar119;
        auVar197._12_4_ = fVar101 * fVar121;
        auVar123 = blendvps(auVar272,auVar197,auVar48);
        fVar28 = 1.0 - fVar103;
        fVar49 = 1.0 - fVar116;
        fVar52 = 1.0 - fVar118;
        fVar55 = 1.0 - fVar120;
        fVar191 = (float)local_1e8._0_4_ * fVar28 + in_XMM10._0_4_ * fVar103;
        fVar198 = (float)local_1e8._4_4_ * fVar49 + in_XMM10._4_4_ * fVar116;
        fVar199 = (float)uStack_1e0 * fVar52 + in_XMM10._8_4_ * fVar118;
        fVar200 = uStack_1e0._4_4_ * fVar55 + in_XMM10._12_4_ * fVar120;
        local_248._4_4_ = (float)local_248._4_4_ * fVar49 + (float)local_108._4_4_ * fVar116;
        local_248._0_4_ = (float)local_248._0_4_ * fVar28 + (float)local_108._0_4_ * fVar103;
        uStack_240._0_4_ = (float)uStack_240 * fVar52 + fStack_100 * fVar118;
        uStack_240._4_4_ = uStack_240._4_4_ * fVar55 + fStack_fc * fVar120;
        local_238._4_4_ = (float)local_238._4_4_ * fVar49 + (float)local_f8._4_4_ * fVar116;
        local_238._0_4_ = (float)local_238._0_4_ * fVar28 + (float)local_f8._0_4_ * fVar103;
        uStack_230._0_4_ = (float)uStack_230 * fVar52 + fStack_f0 * fVar118;
        uStack_230._4_4_ = uStack_230._4_4_ * fVar55 + fStack_ec * fVar120;
        local_188._4_4_ = (float)local_188._4_4_ * fVar49 + (float)local_e8._4_4_ * fVar116;
        local_188._0_4_ = (float)local_188._0_4_ * fVar28 + (float)local_e8._0_4_ * fVar103;
        fStack_180 = fStack_180 * fVar52 + fStack_e0 * fVar118;
        fStack_17c = fStack_17c * fVar55 + fStack_dc * fVar120;
        local_1d8._4_4_ = (float)local_1d8._4_4_ * fVar49 + (float)local_d8._4_4_ * fVar116;
        local_1d8._0_4_ = (float)local_1d8._0_4_ * fVar28 + (float)local_d8._0_4_ * fVar103;
        fStack_1d0 = fStack_1d0 * fVar52 + fStack_d0 * fVar118;
        fStack_1cc = fStack_1cc * fVar55 + fStack_cc * fVar120;
        local_228._4_4_ = (float)local_228._4_4_ * fVar49 + (float)local_c8._4_4_ * fVar116;
        local_228._0_4_ = (float)local_228._0_4_ * fVar28 + (float)local_c8._0_4_ * fVar103;
        uStack_220._0_4_ = (float)uStack_220 * fVar52 + fStack_c0 * fVar118;
        uStack_220._4_4_ = uStack_220._4_4_ * fVar55 + fStack_bc * fVar120;
        local_1f8._4_4_ = (float)local_1f8._4_4_ * fVar49 + (float)local_b8._4_4_ * fVar116;
        local_1f8._0_4_ = (float)local_1f8._0_4_ * fVar28 + (float)local_b8._0_4_ * fVar103;
        uStack_1f0._0_4_ = (float)uStack_1f0 * fVar52 + fStack_b0 * fVar118;
        uStack_1f0._4_4_ = uStack_1f0._4_4_ * fVar55 + fStack_ac * fVar120;
        local_1b8._4_4_ = (float)local_1b8._4_4_ * fVar49 + (float)local_a8._4_4_ * fVar116;
        local_1b8._0_4_ = (float)local_1b8._0_4_ * fVar28 + (float)local_a8._0_4_ * fVar103;
        fStack_1b0 = fStack_1b0 * fVar52 + fStack_a0 * fVar118;
        fStack_1ac = fStack_1ac * fVar55 + fStack_9c * fVar120;
        local_1c8._4_4_ = (float)local_1c8._4_4_ * fVar49 + (float)local_148._4_4_ * fVar116;
        local_1c8._0_4_ = (float)local_1c8._0_4_ * fVar28 + (float)local_148._0_4_ * fVar103;
        fStack_1c0 = fStack_1c0 * fVar52 + fStack_140 * fVar118;
        fStack_1bc = fStack_1bc * fVar55 + fStack_13c * fVar120;
        local_198._4_4_ = (float)local_198._4_4_ * fVar49 + (float)local_158._4_4_ * fVar116;
        local_198._0_4_ = (float)local_198._0_4_ * fVar28 + (float)local_158._0_4_ * fVar103;
        fStack_190 = fStack_190 * fVar52 + fStack_150 * fVar118;
        fStack_18c = fStack_18c * fVar55 + fStack_14c * fVar120;
        local_1a8._4_4_ = (float)local_1a8._4_4_ * fVar49 + (float)local_208._4_4_ * fVar116;
        local_1a8._0_4_ = (float)local_1a8._0_4_ * fVar28 + (float)local_208._0_4_ * fVar103;
        fStack_1a0 = fStack_1a0 * fVar52 + fStack_200 * fVar118;
        fStack_19c = fStack_19c * fVar55 + fStack_1fc * fVar120;
        local_158._4_4_ = fVar49 * (float)local_258._4_4_ + (float)local_218._4_4_ * fVar116;
        local_158._0_4_ = fVar28 * (float)local_258._0_4_ + (float)local_218._0_4_ * fVar103;
        fStack_150 = fVar52 * (float)uStack_250 + fStack_210 * fVar118;
        fStack_14c = fVar55 * uStack_250._4_4_ + fStack_20c * fVar120;
        fVar103 = auVar95._0_4_;
        fVar116 = auVar95._4_4_;
        fVar120 = auVar95._12_4_;
        local_168._0_4_ = auVar106._0_4_;
        local_168._4_4_ = auVar106._4_4_;
        fStack_160 = auVar106._8_4_;
        fStack_15c = auVar106._12_4_;
        fVar118 = auVar95._8_4_;
        fVar58 = auVar109._0_4_;
        fVar117 = auVar109._4_4_;
        fVar74 = auVar109._8_4_;
        fVar121 = auVar109._12_4_;
        fVar28 = auVar123._0_4_;
        fVar49 = auVar123._4_4_;
        fVar52 = auVar123._8_4_;
        fVar55 = auVar123._12_4_;
        fVar102 = fVar103 * fVar58 + (float)local_168._0_4_ * fVar28;
        fVar234 = fVar116 * fVar117 + (float)local_168._4_4_ * fVar49;
        fVar237 = fVar118 * fVar74 + fStack_160 * fVar52;
        fVar240 = fVar120 * fVar121 + fStack_15c * fVar55;
        fVar229 = fVar103 * fVar58 - (float)local_168._0_4_ * fVar28;
        fVar233 = fVar116 * fVar117 - (float)local_168._4_4_ * fVar49;
        fVar236 = fVar118 * fVar74 - fStack_160 * fVar52;
        fVar239 = fVar120 * fVar121 - fStack_15c * fVar55;
        fVar201 = fVar58 * fVar58;
        fVar208 = fVar117 * fVar117;
        fVar209 = fVar74 * fVar74;
        fVar210 = fVar121 * fVar121;
        fVar192 = (float)local_168._0_4_ * (float)local_168._0_4_ - fVar103 * fVar103;
        fVar93 = (float)local_168._4_4_ * (float)local_168._4_4_ - fVar116 * fVar116;
        fVar100 = fStack_160 * fStack_160 - fVar118 * fVar118;
        fVar101 = fStack_15c * fStack_15c - fVar120 * fVar120;
        fVar155 = fVar103 * fVar28 - (float)local_168._0_4_ * fVar58;
        fVar188 = fVar116 * fVar49 - (float)local_168._4_4_ * fVar117;
        fVar189 = fVar118 * fVar52 - fStack_160 * fVar74;
        fVar190 = fVar120 * fVar55 - fStack_15c * fVar121;
        fVar104 = (float)local_168._0_4_ * fVar58 + fVar103 * fVar28;
        fVar72 = (float)local_168._4_4_ * fVar117 + fVar116 * fVar49;
        fVar73 = fStack_160 * fVar74 + fVar118 * fVar52;
        fVar119 = fStack_15c * fVar121 + fVar120 * fVar55;
        fVar211 = fVar28 * fVar58 + fVar103 * (float)local_168._0_4_;
        fVar220 = fVar49 * fVar117 + fVar116 * (float)local_168._4_4_;
        fVar221 = fVar52 * fVar74 + fVar118 * fStack_160;
        fVar222 = fVar55 * fVar121 + fVar120 * fStack_15c;
        fVar58 = fVar28 * fVar58 - fVar103 * (float)local_168._0_4_;
        fVar117 = fVar49 * fVar117 - fVar116 * (float)local_168._4_4_;
        fVar74 = fVar52 * fVar74 - fVar118 * fStack_160;
        fVar121 = fVar55 * fVar121 - fVar120 * fStack_15c;
        fVar28 = fVar28 * fVar28;
        fVar49 = fVar49 * fVar49;
        fVar52 = fVar52 * fVar52;
        fVar55 = fVar55 * fVar55;
        fVar241 = (((float)local_168._0_4_ * (float)local_168._0_4_ + fVar103 * fVar103) - fVar201)
                  - fVar28;
        fVar245 = (((float)local_168._4_4_ * (float)local_168._4_4_ + fVar116 * fVar116) - fVar208)
                  - fVar49;
        fVar246 = ((fStack_160 * fStack_160 + fVar118 * fVar118) - fVar209) - fVar52;
        fVar247 = ((fStack_15c * fStack_15c + fVar120 * fVar120) - fVar210) - fVar55;
        fVar103 = (fVar201 + fVar192) - fVar28;
        fVar116 = (fVar208 + fVar93) - fVar49;
        fVar118 = (fVar209 + fVar100) - fVar52;
        fVar120 = (fVar210 + fVar101) - fVar55;
        fVar28 = (fVar192 - fVar201) + fVar28;
        fVar49 = (fVar93 - fVar208) + fVar49;
        fVar52 = (fVar100 - fVar209) + fVar52;
        fVar55 = (fVar101 - fVar210) + fVar55;
        _local_58 = in_XMM11;
      }
      fVar264 = (fVar155 + fVar155) * 0.0;
      fVar273 = (fVar188 + fVar188) * 0.0;
      fVar275 = (fVar189 + fVar189) * 0.0;
      fVar277 = (fVar190 + fVar190) * 0.0;
      fVar192 = (fVar102 + fVar102) * 0.0;
      fVar93 = (fVar234 + fVar234) * 0.0;
      fVar100 = (fVar237 + fVar237) * 0.0;
      fVar101 = (fVar240 + fVar240) * 0.0;
      fVar201 = fVar192 + fVar264 + fVar241;
      fVar208 = fVar93 + fVar273 + fVar245;
      fVar209 = fVar100 + fVar275 + fVar246;
      fVar210 = fVar101 + fVar277 + fVar247;
      fVar264 = fVar264 + fVar102 + fVar102 + fVar241 * 0.0;
      fVar273 = fVar273 + fVar234 + fVar234 + fVar245 * 0.0;
      fVar275 = fVar275 + fVar237 + fVar237 + fVar246 * 0.0;
      fVar277 = fVar277 + fVar240 + fVar240 + fVar247 * 0.0;
      fVar280 = fVar241 * 0.0 + fVar155 + fVar155 + fVar192;
      fVar288 = fVar245 * 0.0 + fVar188 + fVar188 + fVar93;
      fVar291 = fVar246 * 0.0 + fVar189 + fVar189 + fVar100;
      fVar294 = fVar247 * 0.0 + fVar190 + fVar190 + fVar101;
      fVar192 = (fVar211 + fVar211) * 0.0;
      fVar93 = (fVar220 + fVar220) * 0.0;
      fVar100 = (fVar221 + fVar221) * 0.0;
      fVar101 = (fVar222 + fVar222) * 0.0;
      fVar155 = fVar192 + fVar103 * 0.0 + fVar229 + fVar229;
      fVar188 = fVar93 + fVar116 * 0.0 + fVar233 + fVar233;
      fVar189 = fVar100 + fVar118 * 0.0 + fVar236 + fVar236;
      fVar190 = fVar101 + fVar120 * 0.0 + fVar239 + fVar239;
      fVar249 = (fVar229 + fVar229) * 0.0;
      fVar258 = (fVar233 + fVar233) * 0.0;
      fVar260 = (fVar236 + fVar236) * 0.0;
      fVar262 = (fVar239 + fVar239) * 0.0;
      fVar192 = fVar103 + fVar192 + fVar249;
      fVar93 = fVar116 + fVar93 + fVar258;
      fVar100 = fVar118 + fVar100 + fVar260;
      fVar101 = fVar120 + fVar101 + fVar262;
      fVar249 = fVar249 + fVar103 * 0.0 + fVar211 + fVar211;
      fVar258 = fVar258 + fVar116 * 0.0 + fVar220 + fVar220;
      fVar260 = fVar260 + fVar118 * 0.0 + fVar221 + fVar221;
      fVar262 = fVar262 + fVar120 * 0.0 + fVar222 + fVar222;
      fVar103 = (fVar58 + fVar58) * 0.0;
      fVar116 = (fVar117 + fVar117) * 0.0;
      fVar118 = (fVar74 + fVar74) * 0.0;
      fVar120 = (fVar121 + fVar121) * 0.0;
      fVar250 = fVar103 + fVar28 * 0.0 + fVar104 + fVar104;
      fVar259 = fVar116 + fVar49 * 0.0 + fVar72 + fVar72;
      fVar261 = fVar118 + fVar52 * 0.0 + fVar73 + fVar73;
      fVar263 = fVar120 + fVar55 * 0.0 + fVar119 + fVar119;
      fVar102 = (fVar104 + fVar104) * 0.0;
      fVar234 = (fVar72 + fVar72) * 0.0;
      fVar237 = (fVar73 + fVar73) * 0.0;
      fVar240 = (fVar119 + fVar119) * 0.0;
      fVar241 = fVar28 * 0.0 + fVar58 + fVar58 + fVar102;
      fVar245 = fVar49 * 0.0 + fVar117 + fVar117 + fVar234;
      fVar246 = fVar52 * 0.0 + fVar74 + fVar74 + fVar237;
      fVar247 = fVar55 * 0.0 + fVar121 + fVar121 + fVar240;
      fVar102 = fVar102 + fVar103 + fVar28;
      fVar234 = fVar234 + fVar116 + fVar49;
      fVar237 = fVar237 + fVar118 + fVar52;
      fVar240 = fVar240 + fVar120 + fVar55;
      fVar279 = fVar191 * fVar201 + fVar155 * 0.0 + fVar250 * 0.0;
      fVar286 = fVar198 * fVar208 + fVar188 * 0.0 + fVar259 * 0.0;
      fVar289 = fVar199 * fVar209 + fVar189 * 0.0 + fVar261 * 0.0;
      fVar292 = fVar200 * fVar210 + fVar190 * 0.0 + fVar263 * 0.0;
      fVar287 = fVar191 * fVar264 + fVar192 * 0.0 + fVar241 * 0.0;
      fVar290 = fVar198 * fVar273 + fVar93 * 0.0 + fVar245 * 0.0;
      fVar293 = fVar199 * fVar275 + fVar100 * 0.0 + fVar246 * 0.0;
      fVar248 = fVar200 * fVar277 + fVar101 * 0.0 + fVar247 * 0.0;
      fVar73 = fVar191 * fVar280 + fVar249 * 0.0 + fVar102 * 0.0;
      fVar119 = fVar198 * fVar288 + fVar258 * 0.0 + fVar234 * 0.0;
      fVar191 = fVar199 * fVar291 + fVar260 * 0.0 + fVar237 * 0.0;
      fVar199 = fVar200 * fVar294 + fVar262 * 0.0 + fVar240 * 0.0;
      fVar74 = (float)local_188._0_4_ * fVar201 + (float)local_1d8._0_4_ * fVar155 + fVar250 * 0.0;
      fVar121 = (float)local_188._4_4_ * fVar208 + (float)local_1d8._4_4_ * fVar188 + fVar259 * 0.0;
      fVar198 = fStack_180 * fVar209 + fStack_1d0 * fVar189 + fVar261 * 0.0;
      fVar200 = fStack_17c * fVar210 + fStack_1cc * fVar190 + fVar263 * 0.0;
      fVar103 = (float)local_188._0_4_ * fVar264 + (float)local_1d8._0_4_ * fVar192 + fVar241 * 0.0;
      fVar116 = (float)local_188._4_4_ * fVar273 + (float)local_1d8._4_4_ * fVar93 + fVar245 * 0.0;
      fVar118 = fStack_180 * fVar275 + fStack_1d0 * fVar100 + fVar246 * 0.0;
      fVar120 = fStack_17c * fVar277 + fStack_1cc * fVar101 + fVar247 * 0.0;
      fVar265 = (float)local_188._0_4_ * fVar280 + (float)local_1d8._0_4_ * fVar249 + fVar102 * 0.0;
      fVar274 = (float)local_188._4_4_ * fVar288 + (float)local_1d8._4_4_ * fVar258 + fVar234 * 0.0;
      fVar276 = fStack_180 * fVar291 + fStack_1d0 * fVar260 + fVar237 * 0.0;
      fVar278 = fStack_17c * fVar294 + fStack_1cc * fVar262 + fVar240 * 0.0;
      fVar104 = (float)local_1f8._0_4_ * fVar201 +
                (float)local_1b8._0_4_ * fVar155 + (float)local_1c8._0_4_ * fVar250;
      fVar58 = (float)local_1f8._4_4_ * fVar208 +
               (float)local_1b8._4_4_ * fVar188 + (float)local_1c8._4_4_ * fVar259;
      fVar72 = (float)uStack_1f0 * fVar209 + fStack_1b0 * fVar189 + fStack_1c0 * fVar261;
      fVar117 = uStack_1f0._4_4_ * fVar210 + fStack_1ac * fVar190 + fStack_1bc * fVar263;
      fVar229 = (float)local_1f8._0_4_ * fVar264 +
                (float)local_1b8._0_4_ * fVar192 + (float)local_1c8._0_4_ * fVar241;
      fVar233 = (float)local_1f8._4_4_ * fVar273 +
                (float)local_1b8._4_4_ * fVar93 + (float)local_1c8._4_4_ * fVar245;
      fVar236 = (float)uStack_1f0 * fVar275 + fStack_1b0 * fVar100 + fStack_1c0 * fVar246;
      fVar239 = uStack_1f0._4_4_ * fVar277 + fStack_1ac * fVar101 + fStack_1bc * fVar247;
      fVar211 = (float)local_1f8._0_4_ * fVar280 +
                (float)local_1b8._0_4_ * fVar249 + (float)local_1c8._0_4_ * fVar102;
      fVar220 = (float)local_1f8._4_4_ * fVar288 +
                (float)local_1b8._4_4_ * fVar258 + (float)local_1c8._4_4_ * fVar234;
      fVar221 = (float)uStack_1f0 * fVar291 + fStack_1b0 * fVar260 + fStack_1c0 * fVar237;
      fVar222 = uStack_1f0._4_4_ * fVar294 + fStack_1ac * fVar262 + fStack_1bc * fVar240;
      fVar155 = fVar201 * (float)local_198._0_4_ +
                fVar155 * (float)local_1a8._0_4_ + fVar250 * (float)local_158._0_4_ +
                (float)local_248._0_4_ + 0.0;
      fVar188 = fVar208 * (float)local_198._4_4_ +
                fVar188 * (float)local_1a8._4_4_ + fVar259 * (float)local_158._4_4_ +
                (float)local_248._4_4_ + 0.0;
      fVar189 = fVar209 * fStack_190 + fVar189 * fStack_1a0 + fVar261 * fStack_150 +
                (float)uStack_240 + 0.0;
      fVar190 = fVar210 * fStack_18c + fVar190 * fStack_19c + fVar263 * fStack_14c +
                uStack_240._4_4_ + 0.0;
      fVar28 = fVar264 * (float)local_198._0_4_ +
               fVar192 * (float)local_1a8._0_4_ + fVar241 * (float)local_158._0_4_ +
               (float)local_238._0_4_ + 0.0;
      fVar49 = fVar273 * (float)local_198._4_4_ +
               fVar93 * (float)local_1a8._4_4_ + fVar245 * (float)local_158._4_4_ +
               (float)local_238._4_4_ + 0.0;
      fVar52 = fVar275 * fStack_190 + fVar100 * fStack_1a0 + fVar246 * fStack_150 +
               (float)uStack_230 + 0.0;
      fVar55 = fVar277 * fStack_18c + fVar101 * fStack_19c + fVar247 * fStack_14c +
               uStack_230._4_4_ + 0.0;
      fVar201 = fVar280 * (float)local_198._0_4_ +
                fVar249 * (float)local_1a8._0_4_ + fVar102 * (float)local_158._0_4_ +
                (float)local_228._0_4_ + 0.0;
      fVar208 = fVar288 * (float)local_198._4_4_ +
                fVar258 * (float)local_1a8._4_4_ + fVar234 * (float)local_158._4_4_ +
                (float)local_228._4_4_ + 0.0;
      fVar209 = fVar291 * fStack_190 + fVar260 * fStack_1a0 + fVar237 * fStack_150 +
                (float)uStack_220 + 0.0;
      fVar210 = fVar294 * fStack_18c + fVar262 * fStack_19c + fVar240 * fStack_14c +
                uStack_220._4_4_ + 0.0;
      auVar77._0_4_ = fVar103 * fVar211 - fVar265 * fVar229;
      auVar77._4_4_ = fVar116 * fVar220 - fVar274 * fVar233;
      auVar77._8_4_ = fVar118 * fVar221 - fVar276 * fVar236;
      auVar77._12_4_ = fVar120 * fVar222 - fVar278 * fVar239;
      auVar112._0_4_ = fVar265 * fVar104 - fVar74 * fVar211;
      auVar112._4_4_ = fVar274 * fVar58 - fVar121 * fVar220;
      auVar112._8_4_ = fVar276 * fVar72 - fVar198 * fVar221;
      auVar112._12_4_ = fVar278 * fVar117 - fVar200 * fVar222;
      auVar125._0_4_ = fVar74 * fVar229 - fVar103 * fVar104;
      auVar125._4_4_ = fVar121 * fVar233 - fVar116 * fVar58;
      auVar125._8_4_ = fVar198 * fVar236 - fVar118 * fVar72;
      auVar125._12_4_ = fVar200 * fVar239 - fVar120 * fVar117;
      auVar254._0_4_ = fVar229 * fVar73 - fVar211 * fVar287;
      auVar254._4_4_ = fVar233 * fVar119 - fVar220 * fVar290;
      auVar254._8_4_ = fVar236 * fVar191 - fVar221 * fVar293;
      auVar254._12_4_ = fVar239 * fVar199 - fVar222 * fVar248;
      auVar204._0_4_ = fVar211 * fVar279 - fVar104 * fVar73;
      auVar204._4_4_ = fVar220 * fVar286 - fVar58 * fVar119;
      auVar204._8_4_ = fVar221 * fVar289 - fVar72 * fVar191;
      auVar204._12_4_ = fVar222 * fVar292 - fVar117 * fVar199;
      auVar160._0_4_ = fVar104 * fVar287 - fVar229 * fVar279;
      auVar160._4_4_ = fVar58 * fVar290 - fVar233 * fVar286;
      auVar160._8_4_ = fVar72 * fVar293 - fVar236 * fVar289;
      auVar160._12_4_ = fVar117 * fVar248 - fVar239 * fVar292;
      auVar226._0_4_ = fVar287 * fVar265 - fVar73 * fVar103;
      auVar226._4_4_ = fVar290 * fVar274 - fVar119 * fVar116;
      auVar226._8_4_ = fVar293 * fVar276 - fVar191 * fVar118;
      auVar226._12_4_ = fVar248 * fVar278 - fVar199 * fVar120;
      auVar218._0_4_ = fVar73 * fVar74 - fVar265 * fVar279;
      auVar218._4_4_ = fVar119 * fVar121 - fVar274 * fVar286;
      auVar218._8_4_ = fVar191 * fVar198 - fVar276 * fVar289;
      auVar218._12_4_ = fVar199 * fVar200 - fVar278 * fVar292;
      auVar270._4_4_ = fVar116 * fVar286 - fVar121 * fVar290;
      auVar270._0_4_ = fVar103 * fVar279 - fVar74 * fVar287;
      auVar270._8_4_ = fVar118 * fVar289 - fVar198 * fVar293;
      auVar270._12_4_ = fVar120 * fVar292 - fVar200 * fVar248;
      auVar230._0_4_ = fVar279 * auVar77._0_4_ + fVar287 * auVar112._0_4_ + fVar73 * auVar125._0_4_;
      auVar230._4_4_ = fVar286 * auVar77._4_4_ + fVar290 * auVar112._4_4_ + fVar119 * auVar125._4_4_
      ;
      auVar230._8_4_ = fVar289 * auVar77._8_4_ + fVar293 * auVar112._8_4_ + fVar191 * auVar125._8_4_
      ;
      auVar230._12_4_ =
           fVar292 * auVar77._12_4_ + fVar248 * auVar112._12_4_ + fVar199 * auVar125._12_4_;
      auVar106 = divps(auVar77,auVar230);
      auVar252 = divps(auVar254,auVar230);
      auVar224 = divps(auVar226,auVar230);
      auVar109 = divps(auVar112,auVar230);
      auVar95 = divps(auVar204,auVar230);
      auVar214 = divps(auVar218,auVar230);
      auVar123 = divps(auVar125,auVar230);
      auVar157 = divps(auVar160,auVar230);
      auVar267 = divps(auVar270,auVar230);
      fVar192 = fVar155 * auVar106._0_4_ + fVar28 * auVar109._0_4_ + fVar201 * auVar123._0_4_;
      fVar93 = fVar188 * auVar106._4_4_ + fVar49 * auVar109._4_4_ + fVar208 * auVar123._4_4_;
      fVar100 = fVar189 * auVar106._8_4_ + fVar52 * auVar109._8_4_ + fVar209 * auVar123._8_4_;
      fVar101 = fVar190 * auVar106._12_4_ + fVar55 * auVar109._12_4_ + fVar210 * auVar123._12_4_;
      fVar102 = fVar155 * auVar252._0_4_ + fVar28 * auVar95._0_4_ + fVar201 * auVar157._0_4_;
      fVar234 = fVar188 * auVar252._4_4_ + fVar49 * auVar95._4_4_ + fVar208 * auVar157._4_4_;
      fVar237 = fVar189 * auVar252._8_4_ + fVar52 * auVar95._8_4_ + fVar209 * auVar157._8_4_;
      fVar240 = fVar190 * auVar252._12_4_ + fVar55 * auVar95._12_4_ + fVar210 * auVar157._12_4_;
      fVar103 = fVar155 * auVar224._0_4_ + fVar28 * auVar214._0_4_ + fVar201 * auVar267._0_4_;
      fVar116 = fVar188 * auVar224._4_4_ + fVar49 * auVar214._4_4_ + fVar208 * auVar267._4_4_;
      fVar118 = fVar189 * auVar224._8_4_ + fVar52 * auVar214._8_4_ + fVar209 * auVar267._8_4_;
      fVar120 = fVar190 * auVar224._12_4_ + fVar55 * auVar214._12_4_ + fVar210 * auVar267._12_4_;
    }
    else {
      fVar103 = (pIVar9->super_Geometry).fnumTimeSegments;
      fVar116 = (pIVar9->super_Geometry).time_range.lower;
      auVar90._0_4_ = (pIVar9->super_Geometry).time_range.upper - fVar116;
      auVar59._4_4_ = fVar116;
      auVar59._0_4_ = fVar116;
      auVar59._8_4_ = fVar116;
      auVar59._12_4_ = fVar116;
      auVar105._0_4_ = *(float *)(ray + 0x70) - fVar116;
      auVar105._4_4_ = *(float *)(ray + 0x74) - fVar116;
      auVar105._8_4_ = *(float *)(ray + 0x78) - fVar116;
      auVar105._12_4_ = *(float *)(ray + 0x7c) - fVar116;
      auVar90._4_4_ = auVar90._0_4_;
      auVar90._8_4_ = auVar90._0_4_;
      auVar90._12_4_ = auVar90._0_4_;
      auVar106 = divps(auVar105,auVar90);
      auVar107._0_4_ = auVar106._0_4_ * fVar103;
      auVar107._4_4_ = auVar106._4_4_ * fVar103;
      auVar107._8_4_ = auVar106._8_4_ * fVar103;
      auVar107._12_4_ = auVar106._12_4_ * fVar103;
      auVar106 = roundps(auVar59,auVar107,1);
      auVar30._0_4_ = fVar103 + -1.0;
      auVar30._4_4_ = auVar30._0_4_;
      auVar30._8_4_ = auVar30._0_4_;
      auVar30._12_4_ = auVar30._0_4_;
      auVar106 = minps(auVar106,auVar30);
      auVar106 = maxps(auVar106,ZEXT816(0));
      fVar103 = auVar107._0_4_ - auVar106._0_4_;
      fVar116 = auVar107._4_4_ - auVar106._4_4_;
      fVar118 = auVar107._8_4_ - auVar106._8_4_;
      fVar120 = auVar107._12_4_ - auVar106._12_4_;
      iVar228 = (int)auVar106._0_4_;
      iVar232 = (int)auVar106._4_4_;
      iVar235 = (int)auVar106._8_4_;
      iVar238 = (int)auVar106._12_4_;
      local_98 = CONCAT44(iVar232,iVar228);
      uStack_90 = (RTCRayQueryContext *)CONCAT44(iVar238,iVar235);
      lVar14 = 0;
      if ((uVar26 & 0xff) != 0) {
        for (; ((uVar26 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      iVar8 = *(int *)((long)&local_98 + lVar14 * 4);
      auVar31._0_4_ = -(uint)(iVar8 == iVar228);
      auVar31._4_4_ = -(uint)(iVar8 == iVar232);
      auVar31._8_4_ = -(uint)(iVar8 == iVar235);
      auVar31._12_4_ = -(uint)(iVar8 == iVar238);
      iVar27 = movmskps((int)valid_i,~auVar31 & local_48);
      if (iVar27 == 0) {
        pAVar11 = pIVar9->local2world;
        pAVar13 = pAVar11 + iVar8;
        fVar28 = (pAVar13->l).vx.field_0.m128[0];
        fVar49 = (pAVar13->l).vx.field_0.m128[1];
        fVar52 = (pAVar13->l).vx.field_0.m128[2];
        pVVar2 = &pAVar11[iVar8].l.vy;
        fVar55 = (pVVar2->field_0).m128[0];
        fVar192 = (pVVar2->field_0).m128[1];
        fVar93 = (pVVar2->field_0).m128[2];
        pVVar2 = &pAVar11[iVar8].l.vz;
        fVar100 = (pVVar2->field_0).m128[0];
        fVar101 = (pVVar2->field_0).m128[1];
        fVar102 = (pVVar2->field_0).m128[2];
        pVVar2 = &pAVar11[iVar8].p;
        fVar234 = (pVVar2->field_0).m128[0];
        fVar237 = (pVVar2->field_0).m128[1];
        fVar240 = (pVVar2->field_0).m128[2];
        pAVar13 = pAVar11 + (long)iVar8 + 1;
        fVar104 = (pAVar13->l).vx.field_0.m128[0];
        fVar58 = (pAVar13->l).vx.field_0.m128[1];
        fVar72 = (pAVar13->l).vx.field_0.m128[2];
        fVar279 = 1.0 - fVar103;
        fVar286 = 1.0 - fVar116;
        fVar289 = 1.0 - fVar118;
        fVar292 = 1.0 - fVar120;
        fVar191 = fVar28 * fVar279 + fVar104 * fVar103;
        fVar198 = fVar28 * fVar286 + fVar104 * fVar116;
        fVar199 = fVar28 * fVar289 + fVar104 * fVar118;
        fVar200 = fVar28 * fVar292 + fVar104 * fVar120;
        pVVar2 = &pAVar11[(long)iVar8 + 1].l.vy;
        fVar28 = (pVVar2->field_0).m128[0];
        fVar104 = (pVVar2->field_0).m128[1];
        fVar117 = (pVVar2->field_0).m128[2];
        fVar229 = fVar49 * fVar279 + fVar58 * fVar103;
        fVar233 = fVar49 * fVar286 + fVar58 * fVar116;
        fVar236 = fVar49 * fVar289 + fVar58 * fVar118;
        fVar239 = fVar49 * fVar292 + fVar58 * fVar120;
        fVar201 = fVar52 * fVar279 + fVar72 * fVar103;
        fVar208 = fVar52 * fVar286 + fVar72 * fVar116;
        fVar209 = fVar52 * fVar289 + fVar72 * fVar118;
        fVar210 = fVar52 * fVar292 + fVar72 * fVar120;
        fVar58 = fVar55 * fVar279 + fVar28 * fVar103;
        fVar72 = fVar55 * fVar286 + fVar28 * fVar116;
        fVar73 = fVar55 * fVar289 + fVar28 * fVar118;
        fVar74 = fVar55 * fVar292 + fVar28 * fVar120;
        pVVar2 = &pAVar11[(long)iVar8 + 1].l.vz;
        fVar28 = (pVVar2->field_0).m128[0];
        fVar49 = (pVVar2->field_0).m128[1];
        fVar52 = (pVVar2->field_0).m128[2];
        fVar241 = fVar192 * fVar279 + fVar104 * fVar103;
        fVar245 = fVar192 * fVar286 + fVar104 * fVar116;
        fVar246 = fVar192 * fVar289 + fVar104 * fVar118;
        fVar247 = fVar192 * fVar292 + fVar104 * fVar120;
        fVar264 = fVar93 * fVar279 + fVar117 * fVar103;
        fVar273 = fVar93 * fVar286 + fVar117 * fVar116;
        fVar275 = fVar93 * fVar289 + fVar117 * fVar118;
        fVar277 = fVar93 * fVar292 + fVar117 * fVar120;
        fVar155 = fVar100 * fVar279 + fVar28 * fVar103;
        fVar188 = fVar100 * fVar286 + fVar28 * fVar116;
        fVar189 = fVar100 * fVar289 + fVar28 * fVar118;
        fVar190 = fVar100 * fVar292 + fVar28 * fVar120;
        pVVar2 = &pAVar11[(long)iVar8 + 1].p;
        fVar28 = (pVVar2->field_0).m128[0];
        fVar55 = (pVVar2->field_0).m128[1];
        fVar192 = (pVVar2->field_0).m128[2];
        fVar211 = fVar101 * fVar279 + fVar49 * fVar103;
        fVar220 = fVar101 * fVar286 + fVar49 * fVar116;
        fVar221 = fVar101 * fVar289 + fVar49 * fVar118;
        fVar222 = fVar101 * fVar292 + fVar49 * fVar120;
        fVar93 = fVar102 * fVar279 + fVar52 * fVar103;
        fVar100 = fVar102 * fVar286 + fVar52 * fVar116;
        fVar101 = fVar102 * fVar289 + fVar52 * fVar118;
        fVar102 = fVar102 * fVar292 + fVar52 * fVar120;
        fVar104 = fVar234 * fVar279 + fVar28 * fVar103;
        fVar117 = fVar234 * fVar286 + fVar28 * fVar116;
        fVar119 = fVar234 * fVar289 + fVar28 * fVar118;
        fVar121 = fVar234 * fVar292 + fVar28 * fVar120;
        fVar28 = fVar237 * fVar279 + fVar55 * fVar103;
        fVar49 = fVar237 * fVar286 + fVar55 * fVar116;
        fVar52 = fVar237 * fVar289 + fVar55 * fVar118;
        fVar55 = fVar237 * fVar292 + fVar55 * fVar120;
        fVar103 = fVar279 * fVar240 + fVar192 * fVar103;
        fVar116 = fVar286 * fVar240 + fVar192 * fVar116;
        fVar118 = fVar289 * fVar240 + fVar192 * fVar118;
        fVar120 = fVar292 * fVar240 + fVar192 * fVar120;
        auVar75._0_4_ = fVar241 * fVar93 - fVar264 * fVar211;
        auVar75._4_4_ = fVar245 * fVar100 - fVar273 * fVar220;
        auVar75._8_4_ = fVar246 * fVar101 - fVar275 * fVar221;
        auVar75._12_4_ = fVar247 * fVar102 - fVar277 * fVar222;
        auVar108._0_4_ = fVar264 * fVar155 - fVar58 * fVar93;
        auVar108._4_4_ = fVar273 * fVar188 - fVar72 * fVar100;
        auVar108._8_4_ = fVar275 * fVar189 - fVar73 * fVar101;
        auVar108._12_4_ = fVar277 * fVar190 - fVar74 * fVar102;
        auVar122._0_4_ = fVar58 * fVar211 - fVar241 * fVar155;
        auVar122._4_4_ = fVar72 * fVar220 - fVar245 * fVar188;
        auVar122._8_4_ = fVar73 * fVar221 - fVar246 * fVar189;
        auVar122._12_4_ = fVar74 * fVar222 - fVar247 * fVar190;
        auVar251._0_4_ = fVar201 * fVar211 - fVar229 * fVar93;
        auVar251._4_4_ = fVar208 * fVar220 - fVar233 * fVar100;
        auVar251._8_4_ = fVar209 * fVar221 - fVar236 * fVar101;
        auVar251._12_4_ = fVar210 * fVar222 - fVar239 * fVar102;
        auVar94._0_4_ = fVar93 * fVar191 - fVar201 * fVar155;
        auVar94._4_4_ = fVar100 * fVar198 - fVar208 * fVar188;
        auVar94._8_4_ = fVar101 * fVar199 - fVar209 * fVar189;
        auVar94._12_4_ = fVar102 * fVar200 - fVar210 * fVar190;
        auVar156._0_4_ = fVar155 * fVar229 - fVar211 * fVar191;
        auVar156._4_4_ = fVar188 * fVar233 - fVar220 * fVar198;
        auVar156._8_4_ = fVar189 * fVar236 - fVar221 * fVar199;
        auVar156._12_4_ = fVar190 * fVar239 - fVar222 * fVar200;
        auVar223._0_4_ = fVar229 * fVar264 - fVar201 * fVar241;
        auVar223._4_4_ = fVar233 * fVar273 - fVar208 * fVar245;
        auVar223._8_4_ = fVar236 * fVar275 - fVar209 * fVar246;
        auVar223._12_4_ = fVar239 * fVar277 - fVar210 * fVar247;
        auVar213._0_4_ = fVar201 * fVar58 - fVar264 * fVar191;
        auVar213._4_4_ = fVar208 * fVar72 - fVar273 * fVar198;
        auVar213._8_4_ = fVar209 * fVar73 - fVar275 * fVar199;
        auVar213._12_4_ = fVar210 * fVar74 - fVar277 * fVar200;
        auVar266._4_4_ = fVar245 * fVar198 - fVar72 * fVar233;
        auVar266._0_4_ = fVar241 * fVar191 - fVar58 * fVar229;
        auVar266._8_4_ = fVar246 * fVar199 - fVar73 * fVar236;
        auVar266._12_4_ = fVar247 * fVar200 - fVar74 * fVar239;
        auVar193._0_4_ =
             fVar191 * auVar75._0_4_ + fVar229 * auVar108._0_4_ + fVar201 * auVar122._0_4_;
        auVar193._4_4_ =
             fVar198 * auVar75._4_4_ + fVar233 * auVar108._4_4_ + fVar208 * auVar122._4_4_;
        auVar193._8_4_ =
             fVar199 * auVar75._8_4_ + fVar236 * auVar108._8_4_ + fVar209 * auVar122._8_4_;
        auVar193._12_4_ =
             fVar200 * auVar75._12_4_ + fVar239 * auVar108._12_4_ + fVar210 * auVar122._12_4_;
        auVar106 = divps(auVar75,auVar193);
        auVar252 = divps(auVar251,auVar193);
        auVar224 = divps(auVar223,auVar193);
        auVar109 = divps(auVar108,auVar193);
        auVar95 = divps(auVar94,auVar193);
        auVar214 = divps(auVar213,auVar193);
        auVar123 = divps(auVar122,auVar193);
        auVar157 = divps(auVar156,auVar193);
        auVar267 = divps(auVar266,auVar193);
        fVar192 = fVar104 * auVar106._0_4_ + fVar28 * auVar109._0_4_ + fVar103 * auVar123._0_4_;
        fVar93 = fVar117 * auVar106._4_4_ + fVar49 * auVar109._4_4_ + fVar116 * auVar123._4_4_;
        fVar100 = fVar119 * auVar106._8_4_ + fVar52 * auVar109._8_4_ + fVar118 * auVar123._8_4_;
        fVar101 = fVar121 * auVar106._12_4_ + fVar55 * auVar109._12_4_ + fVar120 * auVar123._12_4_;
        fVar102 = fVar104 * auVar252._0_4_ + fVar28 * auVar95._0_4_ + fVar103 * auVar157._0_4_;
        fVar234 = fVar117 * auVar252._4_4_ + fVar49 * auVar95._4_4_ + fVar116 * auVar157._4_4_;
        fVar237 = fVar119 * auVar252._8_4_ + fVar52 * auVar95._8_4_ + fVar118 * auVar157._8_4_;
        fVar240 = fVar121 * auVar252._12_4_ + fVar55 * auVar95._12_4_ + fVar120 * auVar157._12_4_;
        fVar103 = fVar104 * auVar224._0_4_ + fVar28 * auVar214._0_4_ + fVar103 * auVar267._0_4_;
        fVar116 = fVar117 * auVar224._4_4_ + fVar49 * auVar214._4_4_ + fVar116 * auVar267._4_4_;
        fVar118 = fVar119 * auVar224._8_4_ + fVar52 * auVar214._8_4_ + fVar118 * auVar267._8_4_;
        fVar120 = fVar121 * auVar224._12_4_ + fVar55 * auVar214._12_4_ + fVar120 * auVar267._12_4_;
      }
      else {
        if (uVar26 != 0) {
          pAVar13 = pIVar9->local2world;
          auVar95 = local_48;
          do {
            lVar14 = 0;
            if ((uVar26 & 0xf) != 0) {
              for (; ((uVar26 & 0xf) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
              }
            }
            iVar8 = *(int *)((long)&local_98 + (long)(int)lVar14 * 4);
            auVar39._0_4_ = -(uint)(iVar8 == iVar228);
            auVar39._4_4_ = -(uint)(iVar8 == iVar232);
            auVar39._8_4_ = -(uint)(iVar8 == iVar235);
            auVar39._12_4_ = -(uint)(iVar8 == iVar238);
            auVar39 = auVar39 & auVar95;
            pAVar11 = pAVar13 + iVar8;
            uVar15 = *(undefined4 *)&(pAVar11->l).vx.field_0;
            uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
            uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
            auVar126._4_4_ = uVar15;
            auVar126._0_4_ = uVar15;
            auVar126._8_4_ = uVar15;
            auVar126._12_4_ = uVar15;
            in_XMM8 = blendvps(in_XMM8,auVar126,auVar39);
            auVar127._4_4_ = uVar16;
            auVar127._0_4_ = uVar16;
            auVar127._8_4_ = uVar16;
            auVar127._12_4_ = uVar16;
            in_XMM15 = blendvps(in_XMM15,auVar127,auVar39);
            pVVar2 = &pAVar13[iVar8].l.vy;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            auVar78._4_4_ = uVar17;
            auVar78._0_4_ = uVar17;
            auVar78._8_4_ = uVar17;
            auVar78._12_4_ = uVar17;
            in_XMM12 = blendvps(in_XMM12,auVar78,auVar39);
            auVar79._4_4_ = uVar15;
            auVar79._0_4_ = uVar15;
            auVar79._8_4_ = uVar15;
            auVar79._12_4_ = uVar15;
            _local_178 = blendvps(_local_178,auVar79,auVar39);
            auVar80._4_4_ = uVar16;
            auVar80._0_4_ = uVar16;
            auVar80._8_4_ = uVar16;
            auVar80._12_4_ = uVar16;
            _local_248 = blendvps(_local_248,auVar80,auVar39);
            pVVar2 = &pAVar13[iVar8].l.vz;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            auVar128._4_4_ = uVar18;
            auVar128._0_4_ = uVar18;
            auVar128._8_4_ = uVar18;
            auVar128._12_4_ = uVar18;
            _local_228 = blendvps(_local_228,auVar128,auVar39);
            auVar129._4_4_ = uVar15;
            auVar129._0_4_ = uVar15;
            auVar129._8_4_ = uVar15;
            auVar129._12_4_ = uVar15;
            in_XMM6 = blendvps(in_XMM6,auVar129,auVar39);
            auVar130._4_4_ = uVar16;
            auVar130._0_4_ = uVar16;
            auVar130._8_4_ = uVar16;
            auVar130._12_4_ = uVar16;
            _local_238 = blendvps(_local_238,auVar130,auVar39);
            pVVar2 = &pAVar13[iVar8].p;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            auVar81._4_4_ = uVar17;
            auVar81._0_4_ = uVar17;
            auVar81._8_4_ = uVar17;
            auVar81._12_4_ = uVar17;
            _local_1f8 = blendvps(_local_1f8,auVar81,auVar39);
            auVar82._4_4_ = uVar15;
            auVar82._0_4_ = uVar15;
            auVar82._8_4_ = uVar15;
            auVar82._12_4_ = uVar15;
            auVar106 = blendvps(auVar106,auVar82,auVar39);
            auVar83._4_4_ = uVar16;
            auVar83._0_4_ = uVar16;
            auVar83._8_4_ = uVar16;
            auVar83._12_4_ = uVar16;
            auVar131._4_4_ = uVar18;
            auVar131._0_4_ = uVar18;
            auVar131._8_4_ = uVar18;
            auVar131._12_4_ = uVar18;
            _local_258 = blendvps(_local_258,auVar83,auVar39);
            _local_1e8 = blendvps(_local_1e8,auVar131,auVar39);
            pAVar11 = pAVar13 + (long)iVar8 + 1;
            uVar15 = *(undefined4 *)&(pAVar11->l).vx.field_0;
            uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
            uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
            auVar132._4_4_ = uVar15;
            auVar132._0_4_ = uVar15;
            auVar132._8_4_ = uVar15;
            auVar132._12_4_ = uVar15;
            in_XMM10 = blendvps(in_XMM10,auVar132,auVar39);
            auVar133._4_4_ = uVar16;
            auVar133._0_4_ = uVar16;
            auVar133._8_4_ = uVar16;
            auVar133._12_4_ = uVar16;
            auVar84._4_4_ = uVar17;
            auVar84._0_4_ = uVar17;
            auVar84._8_4_ = uVar17;
            auVar84._12_4_ = uVar17;
            in_XMM7 = blendvps(in_XMM7,auVar133,auVar39);
            pVVar2 = &pAVar13[(long)iVar8 + 1].l.vy;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            in_XMM13 = blendvps(in_XMM13,auVar84,auVar39);
            auVar85._4_4_ = uVar15;
            auVar85._0_4_ = uVar15;
            auVar85._8_4_ = uVar15;
            auVar85._12_4_ = uVar15;
            in_XMM14 = blendvps(in_XMM14,auVar85,auVar39);
            auVar86._4_4_ = uVar16;
            auVar86._0_4_ = uVar16;
            auVar86._8_4_ = uVar16;
            auVar86._12_4_ = uVar16;
            auVar134._4_4_ = uVar17;
            auVar134._0_4_ = uVar17;
            auVar134._8_4_ = uVar17;
            auVar134._12_4_ = uVar17;
            _local_218 = blendvps(_local_218,auVar86,auVar39);
            pVVar2 = &pAVar13[(long)iVar8 + 1].l.vz;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            _local_1d8 = blendvps(_local_1d8,auVar134,auVar39);
            auVar135._4_4_ = uVar15;
            auVar135._0_4_ = uVar15;
            auVar135._8_4_ = uVar15;
            auVar135._12_4_ = uVar15;
            _local_1c8 = blendvps(_local_1c8,auVar135,auVar39);
            auVar136._4_4_ = uVar16;
            auVar136._0_4_ = uVar16;
            auVar136._8_4_ = uVar16;
            auVar136._12_4_ = uVar16;
            auVar87._4_4_ = uVar17;
            auVar87._0_4_ = uVar17;
            auVar87._8_4_ = uVar17;
            auVar87._12_4_ = uVar17;
            _local_1b8 = blendvps(_local_1b8,auVar136,auVar39);
            pVVar2 = &pAVar13[(long)iVar8 + 1].p;
            uVar15 = *(undefined4 *)&pVVar2->field_0;
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            _local_1a8 = blendvps(_local_1a8,auVar87,auVar39);
            auVar88._4_4_ = uVar15;
            auVar88._0_4_ = uVar15;
            auVar88._8_4_ = uVar15;
            auVar88._12_4_ = uVar15;
            _local_198 = blendvps(_local_198,auVar88,auVar39);
            auVar89._4_4_ = uVar16;
            auVar89._0_4_ = uVar16;
            auVar89._8_4_ = uVar16;
            auVar89._12_4_ = uVar16;
            _local_188 = blendvps(_local_188,auVar89,auVar39);
            auVar137._4_4_ = uVar17;
            auVar137._0_4_ = uVar17;
            auVar137._8_4_ = uVar17;
            auVar137._12_4_ = uVar17;
            auVar90 = blendvps(auVar90,auVar137,auVar39);
            auVar95 = auVar95 ^ auVar39;
            uVar26 = movmskps(iVar8 * 0x40,auVar95);
          } while (uVar26 != 0);
        }
        fVar201 = 1.0 - fVar103;
        fVar208 = 1.0 - fVar116;
        fVar209 = 1.0 - fVar118;
        fVar210 = 1.0 - fVar120;
        fVar73 = in_XMM8._0_4_ * fVar201 + in_XMM10._0_4_ * fVar103;
        fVar74 = in_XMM8._4_4_ * fVar208 + in_XMM10._4_4_ * fVar116;
        fVar119 = in_XMM8._8_4_ * fVar209 + in_XMM10._8_4_ * fVar118;
        fVar121 = in_XMM8._12_4_ * fVar210 + in_XMM10._12_4_ * fVar120;
        fVar241 = in_XMM15._0_4_ * fVar201 + in_XMM7._0_4_ * fVar103;
        fVar246 = in_XMM15._4_4_ * fVar208 + in_XMM7._4_4_ * fVar116;
        fVar264 = in_XMM15._8_4_ * fVar209 + in_XMM7._8_4_ * fVar118;
        fVar275 = in_XMM15._12_4_ * fVar210 + in_XMM7._12_4_ * fVar120;
        fVar211 = in_XMM12._0_4_ * fVar201 + in_XMM13._0_4_ * fVar103;
        fVar221 = in_XMM12._4_4_ * fVar208 + in_XMM13._4_4_ * fVar116;
        fVar229 = in_XMM12._8_4_ * fVar209 + in_XMM13._8_4_ * fVar118;
        fVar236 = in_XMM12._12_4_ * fVar210 + in_XMM13._12_4_ * fVar120;
        fVar245 = (float)local_178._0_4_ * fVar201 + in_XMM14._0_4_ * fVar103;
        fVar247 = (float)local_178._4_4_ * fVar208 + in_XMM14._4_4_ * fVar116;
        fVar273 = fStack_170 * fVar209 + in_XMM14._8_4_ * fVar118;
        fVar277 = fStack_16c * fVar210 + in_XMM14._12_4_ * fVar120;
        fVar191 = (float)local_248._0_4_ * fVar201 + (float)local_218._0_4_ * fVar103;
        fVar198 = (float)local_248._4_4_ * fVar208 + (float)local_218._4_4_ * fVar116;
        fVar199 = (float)uStack_240 * fVar209 + fStack_210 * fVar118;
        fVar200 = uStack_240._4_4_ * fVar210 + fStack_20c * fVar120;
        fVar102 = (float)local_228._0_4_ * fVar201 + (float)local_1d8._0_4_ * fVar103;
        fVar234 = (float)local_228._4_4_ * fVar208 + (float)local_1d8._4_4_ * fVar116;
        fVar237 = (float)uStack_220 * fVar209 + fStack_1d0 * fVar118;
        fVar240 = uStack_220._4_4_ * fVar210 + fStack_1cc * fVar120;
        fVar192 = in_XMM6._0_4_ * fVar201 + (float)local_1c8._0_4_ * fVar103;
        fVar93 = in_XMM6._4_4_ * fVar208 + (float)local_1c8._4_4_ * fVar116;
        fVar100 = in_XMM6._8_4_ * fVar209 + fStack_1c0 * fVar118;
        fVar101 = in_XMM6._12_4_ * fVar210 + fStack_1bc * fVar120;
        fVar155 = (float)local_238._0_4_ * fVar201 + (float)local_1b8._0_4_ * fVar103;
        fVar188 = (float)local_238._4_4_ * fVar208 + (float)local_1b8._4_4_ * fVar116;
        fVar189 = (float)uStack_230 * fVar209 + fStack_1b0 * fVar118;
        fVar190 = uStack_230._4_4_ * fVar210 + fStack_1ac * fVar120;
        fVar220 = (float)local_1f8._0_4_ * fVar201 + (float)local_1a8._0_4_ * fVar103;
        fVar222 = (float)local_1f8._4_4_ * fVar208 + (float)local_1a8._4_4_ * fVar116;
        fVar233 = (float)uStack_1f0 * fVar209 + fStack_1a0 * fVar118;
        fVar239 = uStack_1f0._4_4_ * fVar210 + fStack_19c * fVar120;
        fVar28 = auVar106._0_4_ * fVar201 + (float)local_198._0_4_ * fVar103;
        fVar49 = auVar106._4_4_ * fVar208 + (float)local_198._4_4_ * fVar116;
        fVar52 = auVar106._8_4_ * fVar209 + fStack_190 * fVar118;
        fVar55 = auVar106._12_4_ * fVar210 + fStack_18c * fVar120;
        fVar104 = (float)local_258._0_4_ * fVar201 + (float)local_188._0_4_ * fVar103;
        fVar58 = (float)local_258._4_4_ * fVar208 + (float)local_188._4_4_ * fVar116;
        fVar72 = (float)uStack_250 * fVar209 + fStack_180 * fVar118;
        fVar117 = uStack_250._4_4_ * fVar210 + fStack_17c * fVar120;
        fVar103 = fVar201 * (float)local_1e8._0_4_ + auVar90._0_4_ * fVar103;
        fVar116 = fVar208 * (float)local_1e8._4_4_ + auVar90._4_4_ * fVar116;
        fVar118 = fVar209 * (float)uStack_1e0 + auVar90._8_4_ * fVar118;
        fVar120 = fVar210 * uStack_1e0._4_4_ + auVar90._12_4_ * fVar120;
        auVar91._0_4_ = fVar191 * fVar220 - fVar102 * fVar155;
        auVar91._4_4_ = fVar198 * fVar222 - fVar234 * fVar188;
        auVar91._8_4_ = fVar199 * fVar233 - fVar237 * fVar189;
        auVar91._12_4_ = fVar200 * fVar239 - fVar240 * fVar190;
        auVar113._0_4_ = fVar102 * fVar192 - fVar245 * fVar220;
        auVar113._4_4_ = fVar234 * fVar93 - fVar247 * fVar222;
        auVar113._8_4_ = fVar237 * fVar100 - fVar273 * fVar233;
        auVar113._12_4_ = fVar240 * fVar101 - fVar277 * fVar239;
        auVar138._0_4_ = fVar245 * fVar155 - fVar191 * fVar192;
        auVar138._4_4_ = fVar247 * fVar188 - fVar198 * fVar93;
        auVar138._8_4_ = fVar273 * fVar189 - fVar199 * fVar100;
        auVar138._12_4_ = fVar277 * fVar190 - fVar200 * fVar101;
        auVar255._0_4_ = fVar211 * fVar155 - fVar241 * fVar220;
        auVar255._4_4_ = fVar221 * fVar188 - fVar246 * fVar222;
        auVar255._8_4_ = fVar229 * fVar189 - fVar264 * fVar233;
        auVar255._12_4_ = fVar236 * fVar190 - fVar275 * fVar239;
        auVar243._0_4_ = fVar220 * fVar73 - fVar211 * fVar192;
        auVar243._4_4_ = fVar222 * fVar74 - fVar221 * fVar93;
        auVar243._8_4_ = fVar233 * fVar119 - fVar229 * fVar100;
        auVar243._12_4_ = fVar239 * fVar121 - fVar236 * fVar101;
        auVar161._0_4_ = fVar192 * fVar241 - fVar155 * fVar73;
        auVar161._4_4_ = fVar93 * fVar246 - fVar188 * fVar74;
        auVar161._8_4_ = fVar100 * fVar264 - fVar189 * fVar119;
        auVar161._12_4_ = fVar101 * fVar275 - fVar190 * fVar121;
        auVar227._0_4_ = fVar241 * fVar102 - fVar211 * fVar191;
        auVar227._4_4_ = fVar246 * fVar234 - fVar221 * fVar198;
        auVar227._8_4_ = fVar264 * fVar237 - fVar229 * fVar199;
        auVar227._12_4_ = fVar275 * fVar240 - fVar236 * fVar200;
        auVar219._0_4_ = fVar211 * fVar245 - fVar102 * fVar73;
        auVar219._4_4_ = fVar221 * fVar247 - fVar234 * fVar74;
        auVar219._8_4_ = fVar229 * fVar273 - fVar237 * fVar119;
        auVar219._12_4_ = fVar236 * fVar277 - fVar240 * fVar121;
        auVar284._4_4_ = fVar198 * fVar74 - fVar247 * fVar246;
        auVar284._0_4_ = fVar191 * fVar73 - fVar245 * fVar241;
        auVar284._8_4_ = fVar199 * fVar119 - fVar273 * fVar264;
        auVar284._12_4_ = fVar200 * fVar121 - fVar277 * fVar275;
        auVar205._0_4_ =
             fVar73 * auVar91._0_4_ + fVar241 * auVar113._0_4_ + fVar211 * auVar138._0_4_;
        auVar205._4_4_ =
             fVar74 * auVar91._4_4_ + fVar246 * auVar113._4_4_ + fVar221 * auVar138._4_4_;
        auVar205._8_4_ =
             fVar119 * auVar91._8_4_ + fVar264 * auVar113._8_4_ + fVar229 * auVar138._8_4_;
        auVar205._12_4_ =
             fVar121 * auVar91._12_4_ + fVar275 * auVar113._12_4_ + fVar236 * auVar138._12_4_;
        auVar106 = divps(auVar91,auVar205);
        auVar252 = divps(auVar255,auVar205);
        auVar224 = divps(auVar227,auVar205);
        auVar109 = divps(auVar113,auVar205);
        auVar95 = divps(auVar243,auVar205);
        auVar214 = divps(auVar219,auVar205);
        auVar123 = divps(auVar138,auVar205);
        auVar157 = divps(auVar161,auVar205);
        auVar267 = divps(auVar284,auVar205);
        fVar192 = fVar28 * auVar106._0_4_ + fVar104 * auVar109._0_4_ + fVar103 * auVar123._0_4_;
        fVar93 = fVar49 * auVar106._4_4_ + fVar58 * auVar109._4_4_ + fVar116 * auVar123._4_4_;
        fVar100 = fVar52 * auVar106._8_4_ + fVar72 * auVar109._8_4_ + fVar118 * auVar123._8_4_;
        fVar101 = fVar55 * auVar106._12_4_ + fVar117 * auVar109._12_4_ + fVar120 * auVar123._12_4_;
        fVar102 = fVar28 * auVar252._0_4_ + fVar104 * auVar95._0_4_ + fVar103 * auVar157._0_4_;
        fVar234 = fVar49 * auVar252._4_4_ + fVar58 * auVar95._4_4_ + fVar116 * auVar157._4_4_;
        fVar237 = fVar52 * auVar252._8_4_ + fVar72 * auVar95._8_4_ + fVar118 * auVar157._8_4_;
        fVar240 = fVar55 * auVar252._12_4_ + fVar117 * auVar95._12_4_ + fVar120 * auVar157._12_4_;
        fVar103 = fVar28 * auVar224._0_4_ + fVar104 * auVar214._0_4_ + fVar103 * auVar267._0_4_;
        fVar116 = fVar49 * auVar224._4_4_ + fVar58 * auVar214._4_4_ + fVar116 * auVar267._4_4_;
        fVar118 = fVar52 * auVar224._8_4_ + fVar72 * auVar214._8_4_ + fVar118 * auVar267._8_4_;
        fVar120 = fVar55 * auVar224._12_4_ + fVar117 * auVar214._12_4_ + fVar120 * auVar267._12_4_;
      }
    }
    pRVar1 = ray + 0x10;
    fVar28 = *(float *)pRVar1;
    fVar49 = *(float *)(ray + 0x14);
    fVar52 = *(float *)(ray + 0x18);
    auVar20 = *(undefined1 (*) [12])pRVar1;
    fVar55 = *(float *)(ray + 0x1c);
    auVar139 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x20;
    fVar104 = *(float *)pRVar1;
    fVar58 = *(float *)(ray + 0x24);
    fVar72 = *(float *)(ray + 0x28);
    auVar21 = *(undefined1 (*) [12])pRVar1;
    fVar117 = *(float *)(ray + 0x2c);
    auVar140 = *(undefined1 (*) [16])pRVar1;
    fVar73 = *(float *)ray;
    fVar74 = *(float *)(ray + 4);
    fVar119 = *(float *)(ray + 8);
    auVar22 = *(undefined1 (*) [12])ray;
    fVar121 = *(float *)(ray + 0xc);
    auVar141 = *(undefined1 (*) [16])ray;
    pRVar1 = ray + 0x40;
    fVar155 = *(float *)pRVar1;
    fVar188 = *(float *)(ray + 0x44);
    fVar189 = *(float *)(ray + 0x48);
    auVar25 = *(undefined1 (*) [12])pRVar1;
    fVar190 = *(float *)(ray + 0x4c);
    auVar144 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x50;
    fVar191 = *(float *)pRVar1;
    fVar198 = *(float *)(ray + 0x54);
    fVar199 = *(float *)(ray + 0x58);
    auVar24 = *(undefined1 (*) [12])pRVar1;
    fVar200 = *(float *)(ray + 0x5c);
    auVar143 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x60;
    fVar201 = *(float *)pRVar1;
    fVar208 = *(float *)(ray + 100);
    fVar209 = *(float *)(ray + 0x68);
    auVar23 = *(undefined1 (*) [12])pRVar1;
    fVar210 = *(float *)(ray + 0x6c);
    auVar142 = *(undefined1 (*) [16])pRVar1;
    *(float *)ray =
         auVar106._0_4_ * fVar73 + auVar109._0_4_ * fVar28 + auVar123._0_4_ * fVar104 + -fVar192;
    *(float *)(ray + 4) =
         auVar106._4_4_ * fVar74 + auVar109._4_4_ * fVar49 + auVar123._4_4_ * fVar58 + -fVar93;
    *(float *)(ray + 8) =
         auVar106._8_4_ * fVar119 + auVar109._8_4_ * fVar52 + auVar123._8_4_ * fVar72 + -fVar100;
    *(float *)(ray + 0xc) =
         auVar106._12_4_ * fVar121 + auVar109._12_4_ * fVar55 + auVar123._12_4_ * fVar117 + -fVar101
    ;
    *(float *)(ray + 0x10) =
         auVar252._0_4_ * fVar73 + auVar95._0_4_ * fVar28 + auVar157._0_4_ * fVar104 + -fVar102;
    *(float *)(ray + 0x14) =
         auVar252._4_4_ * fVar74 + auVar95._4_4_ * fVar49 + auVar157._4_4_ * fVar58 + -fVar234;
    *(float *)(ray + 0x18) =
         auVar252._8_4_ * fVar119 + auVar95._8_4_ * fVar52 + auVar157._8_4_ * fVar72 + -fVar237;
    *(float *)(ray + 0x1c) =
         auVar252._12_4_ * fVar121 + auVar95._12_4_ * fVar55 + auVar157._12_4_ * fVar117 + -fVar240;
    *(float *)(ray + 0x20) =
         auVar224._0_4_ * fVar73 + auVar214._0_4_ * fVar28 + auVar267._0_4_ * fVar104 + -fVar103;
    *(float *)(ray + 0x24) =
         auVar224._4_4_ * fVar74 + auVar214._4_4_ * fVar49 + auVar267._4_4_ * fVar58 + -fVar116;
    *(float *)(ray + 0x28) =
         auVar224._8_4_ * fVar119 + auVar214._8_4_ * fVar52 + auVar267._8_4_ * fVar72 + -fVar118;
    *(float *)(ray + 0x2c) =
         auVar224._12_4_ * fVar121 + auVar214._12_4_ * fVar55 + auVar267._12_4_ * fVar117 + -fVar120
    ;
    *(float *)(ray + 0x40) =
         auVar106._0_4_ * fVar155 + auVar109._0_4_ * fVar191 + auVar123._0_4_ * fVar201;
    *(float *)(ray + 0x44) =
         auVar106._4_4_ * fVar188 + auVar109._4_4_ * fVar198 + auVar123._4_4_ * fVar208;
    *(float *)(ray + 0x48) =
         auVar106._8_4_ * fVar189 + auVar109._8_4_ * fVar199 + auVar123._8_4_ * fVar209;
    *(float *)(ray + 0x4c) =
         auVar106._12_4_ * fVar190 + auVar109._12_4_ * fVar200 + auVar123._12_4_ * fVar210;
    *(float *)(ray + 0x50) =
         auVar252._0_4_ * fVar155 + auVar95._0_4_ * fVar191 + auVar157._0_4_ * fVar201;
    *(float *)(ray + 0x54) =
         auVar252._4_4_ * fVar188 + auVar95._4_4_ * fVar198 + auVar157._4_4_ * fVar208;
    *(float *)(ray + 0x58) =
         auVar252._8_4_ * fVar189 + auVar95._8_4_ * fVar199 + auVar157._8_4_ * fVar209;
    *(float *)(ray + 0x5c) =
         auVar252._12_4_ * fVar190 + auVar95._12_4_ * fVar200 + auVar157._12_4_ * fVar210;
    *(float *)(ray + 0x60) =
         auVar224._0_4_ * fVar155 + auVar214._0_4_ * fVar191 + auVar267._0_4_ * fVar201;
    *(float *)(ray + 100) =
         auVar224._4_4_ * fVar188 + auVar214._4_4_ * fVar198 + auVar267._4_4_ * fVar208;
    *(float *)(ray + 0x68) =
         auVar224._8_4_ * fVar189 + auVar214._8_4_ * fVar199 + auVar267._8_4_ * fVar209;
    *(float *)(ray + 0x6c) =
         auVar224._12_4_ * fVar190 + auVar214._12_4_ * fVar200 + auVar267._12_4_ * fVar210;
    local_98 = *(long *)&(pIVar9->super_Geometry).field_0x58;
    local_88 = context->args;
    local_28 = local_48._0_8_;
    uStack_20 = local_48._8_8_;
    uStack_90 = pRVar10;
    local_48 = auVar212;
    (**(code **)(local_98 + 0x98))(&local_28,local_98 + 0x58,ray);
    local_248 = auVar22._0_8_;
    uStack_240 = auVar141._8_8_;
    *(undefined1 (*) [8])ray = local_248;
    *(undefined8 *)(ray + 8) = uStack_240;
    local_1f8 = auVar20._0_8_;
    uStack_1f0 = auVar139._8_8_;
    *(undefined1 (*) [8])(ray + 0x10) = local_1f8;
    *(undefined8 *)(ray + 0x18) = uStack_1f0;
    local_258 = auVar21._0_8_;
    uStack_250 = auVar140._8_8_;
    *(undefined1 (*) [8])(ray + 0x20) = local_258;
    *(undefined8 *)(ray + 0x28) = uStack_250;
    local_1e8 = auVar25._0_8_;
    uStack_1e0 = auVar144._8_8_;
    *(undefined1 (*) [8])(ray + 0x40) = local_1e8;
    *(undefined8 *)(ray + 0x48) = uStack_1e0;
    local_238 = auVar24._0_8_;
    uStack_230 = auVar143._8_8_;
    *(undefined1 (*) [8])(ray + 0x50) = local_238;
    *(undefined8 *)(ray + 0x58) = uStack_230;
    local_228 = auVar23._0_8_;
    uStack_220 = auVar142._8_8_;
    *(undefined1 (*) [8])(ray + 0x60) = local_228;
    *(undefined8 *)(ray + 0x68) = uStack_220;
    pRVar10->instID[0] = 0xffffffff;
    pRVar10->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      vbool<K> valid = valid_i;
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }